

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::UnaryOp_x86_avx::forward_inplace(UnaryOp_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  undefined1 (*pauVar15) [32];
  int iVar16;
  ulong uVar17;
  long lVar18;
  float *pfVar19;
  undefined1 (*pauVar20) [16];
  uint uVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar89;
  float fVar90;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar40 [32];
  undefined1 auVar51 [32];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined1 auVar52 [64];
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined1 auVar53 [64];
  undefined1 auVar91 [56];
  undefined1 auVar54 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar41 [32];
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dd_09;
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dd_10;
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar42 [32];
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Dc_11;
  undefined4 extraout_XMM0_Dc_12;
  undefined4 extraout_XMM0_Dc_13;
  undefined4 extraout_XMM0_Dc_14;
  undefined4 extraout_XMM0_Dc_15;
  undefined4 extraout_XMM0_Dc_16;
  undefined4 extraout_XMM0_Dc_17;
  undefined4 extraout_XMM0_Dd_11;
  undefined4 extraout_XMM0_Dd_12;
  undefined4 extraout_XMM0_Dd_13;
  undefined4 extraout_XMM0_Dd_14;
  undefined4 extraout_XMM0_Dd_15;
  undefined4 extraout_XMM0_Dd_16;
  undefined4 extraout_XMM0_Dd_17;
  undefined1 auVar61 [64];
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Dc_18;
  undefined4 extraout_XMM0_Dc_19;
  undefined4 extraout_XMM0_Dc_20;
  undefined4 extraout_XMM0_Dd_18;
  undefined4 extraout_XMM0_Dd_19;
  undefined4 extraout_XMM0_Dd_20;
  undefined1 auVar62 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar43 [32];
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Dc_21;
  undefined4 extraout_XMM0_Dd_21;
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined4 extraout_XMM0_Db_22;
  undefined4 extraout_XMM0_Dc_22;
  undefined4 extraout_XMM0_Dd_22;
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar46 [32];
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Dc_23;
  undefined4 extraout_XMM0_Dd_23;
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined4 extraout_XMM0_Db_24;
  undefined4 extraout_XMM0_Dc_24;
  undefined4 extraout_XMM0_Dd_24;
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar47 [32];
  undefined4 extraout_XMM0_Db_25;
  undefined4 extraout_XMM0_Db_26;
  undefined4 extraout_XMM0_Db_27;
  undefined4 extraout_XMM0_Db_28;
  undefined4 extraout_XMM0_Db_29;
  undefined4 extraout_XMM0_Db_30;
  undefined4 extraout_XMM0_Db_31;
  undefined4 extraout_XMM0_Dc_25;
  undefined4 extraout_XMM0_Dc_26;
  undefined4 extraout_XMM0_Dc_27;
  undefined4 extraout_XMM0_Dc_28;
  undefined4 extraout_XMM0_Dc_29;
  undefined4 extraout_XMM0_Dc_30;
  undefined4 extraout_XMM0_Dc_31;
  undefined4 extraout_XMM0_Dd_25;
  undefined4 extraout_XMM0_Dd_26;
  undefined4 extraout_XMM0_Dd_27;
  undefined4 extraout_XMM0_Dd_28;
  undefined4 extraout_XMM0_Dd_29;
  undefined4 extraout_XMM0_Dd_30;
  undefined4 extraout_XMM0_Dd_31;
  undefined1 auVar75 [64];
  undefined4 extraout_XMM0_Db_32;
  undefined4 extraout_XMM0_Db_33;
  undefined4 extraout_XMM0_Db_34;
  undefined4 extraout_XMM0_Dc_32;
  undefined4 extraout_XMM0_Dc_33;
  undefined4 extraout_XMM0_Dc_34;
  undefined4 extraout_XMM0_Dd_32;
  undefined4 extraout_XMM0_Dd_33;
  undefined4 extraout_XMM0_Dd_34;
  undefined1 auVar76 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar48 [32];
  undefined4 extraout_XMM0_Db_35;
  undefined4 extraout_XMM0_Dc_35;
  undefined4 extraout_XMM0_Dd_35;
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined4 extraout_XMM0_Db_36;
  undefined4 extraout_XMM0_Dc_36;
  undefined4 extraout_XMM0_Dd_36;
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined4 extraout_XMM0_Db_37;
  undefined4 extraout_XMM0_Dc_37;
  undefined4 extraout_XMM0_Dd_37;
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined4 extraout_XMM0_Db_38;
  undefined4 extraout_XMM0_Dc_38;
  undefined4 extraout_XMM0_Dd_38;
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar96 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar104 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar130;
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar154 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 in_ZMM11 [64];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  __m128 afVar236;
  unary_op_tan op;
  __m256 _p;
  unary_op_tan local_151;
  undefined1 local_150 [16];
  undefined1 local_140 [8];
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined8 local_128;
  undefined1 local_120 [16];
  undefined8 local_110;
  Mat *local_108;
  undefined1 local_100 [32];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  long local_60;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  undefined1 extraout_var_06 [60];
  undefined1 extraout_var_07 [60];
  undefined1 extraout_var_08 [60];
  undefined1 extraout_var_09 [60];
  undefined1 extraout_var_10 [60];
  undefined1 extraout_var_11 [60];
  undefined1 extraout_var_12 [60];
  undefined1 extraout_var_13 [60];
  undefined1 extraout_var_14 [60];
  undefined1 extraout_var_15 [60];
  undefined1 extraout_var_16 [60];
  undefined1 extraout_var_17 [60];
  undefined1 extraout_var_18 [60];
  undefined1 extraout_var_19 [60];
  undefined1 extraout_var_20 [60];
  undefined1 extraout_var_21 [60];
  undefined1 extraout_var_22 [60];
  undefined1 extraout_var_23 [60];
  undefined1 extraout_var_24 [60];
  undefined1 extraout_var_25 [60];
  undefined1 extraout_var_26 [60];
  undefined1 extraout_var_27 [60];
  undefined1 extraout_var_28 [60];
  undefined1 extraout_var_29 [60];
  undefined1 extraout_var_30 [60];
  undefined1 extraout_var_31 [60];
  undefined1 extraout_var_32 [60];
  undefined1 extraout_var_33 [60];
  undefined1 extraout_var_34 [60];
  undefined1 auVar117 [32];
  
  auVar128 = _DAT_0055d1e0;
  auVar113 = _DAT_0055d1c0;
  auVar97 = in_ZMM3._0_16_;
  auVar118 = in_ZMM5._0_16_;
  local_108 = bottom_top_blob;
  switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_UnaryOp_x86_avx[-3])) {
  case 0:
    iVar10 = bottom_top_blob->c;
    if (0 < (long)iVar10) {
      uVar21 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      auVar96._8_4_ = 0x7fffffff;
      auVar96._0_8_ = 0x7fffffff7fffffff;
      auVar96._12_4_ = 0x7fffffff;
      auVar135._8_8_ = 0x8000000000000000;
      auVar135._0_8_ = 0x8000000000000000;
      auVar97 = vpcmpeqd_avx(auVar118,auVar118);
      auVar162._8_4_ = 0x7fffffff;
      auVar162._0_8_ = 0x7fffffff7fffffff;
      auVar162._12_4_ = 0x7fffffff;
      auVar162._16_4_ = 0x7fffffff;
      auVar162._20_4_ = 0x7fffffff;
      auVar162._24_4_ = 0x7fffffff;
      auVar162._28_4_ = 0x7fffffff;
      do {
        pauVar15 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar21 < 8) {
          uVar11 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar200 = *pauVar15;
            auVar185._0_8_ = auVar200._0_8_ ^ 0x8000000080000000;
            auVar185._8_4_ = auVar200._8_4_ ^ 0x80000000;
            auVar185._12_4_ = auVar200._12_4_ ^ 0x80000000;
            auVar185._16_4_ = auVar200._16_4_ ^ 0x80000000;
            auVar185._20_4_ = auVar200._20_4_ ^ 0x80000000;
            auVar185._24_4_ = auVar200._24_4_ ^ 0x80000000;
            auVar185._28_4_ = auVar200._28_4_ ^ 0x80000000;
            auVar200 = vmaxps_avx(auVar185,auVar200);
            *pauVar15 = auVar200;
            pauVar15 = pauVar15 + 1;
            iVar16 = iVar16 + 8;
            uVar11 = uVar21 & 0xfffffff8;
          } while (iVar16 < (int)uVar21);
        }
        uVar13 = uVar11 | 3;
        while ((int)uVar13 < (int)uVar21) {
          auVar118 = vandps_avx(auVar96,*(undefined1 (*) [16])*pauVar15);
          *(undefined1 (*) [16])*pauVar15 = auVar118;
          pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
          uVar13 = uVar11 + 7;
          uVar11 = uVar11 + 4;
        }
        if ((int)uVar11 < (int)uVar21) {
          uVar12 = CONCAT44(0,~uVar11 + uVar21);
          auVar165._8_8_ = 0;
          auVar165._0_8_ = uVar12;
          auVar147 = vpshufd_avx(auVar165,0x44);
          auVar118 = vorps_avx(auVar147,auVar135);
          auVar110 = vorps_avx(auVar147,auVar135);
          auVar147 = vorps_avx(auVar147,auVar135);
          uVar17 = 0;
          do {
            auVar207._8_8_ = 0;
            auVar207._0_8_ = uVar17;
            auVar154 = vpshufd_avx(auVar207,0x44);
            auVar215._16_16_ = auVar154;
            auVar215._0_16_ = auVar154;
            auVar200 = vorps_avx(auVar215,auVar113);
            auVar2 = vorps_avx(auVar215,auVar128);
            auVar226._0_8_ = auVar2._16_8_ ^ 0x8000000000000000;
            auVar226._8_4_ = auVar2._24_4_;
            auVar226._12_4_ = auVar2._28_4_ ^ 0x80000000;
            auVar154 = vpcmpgtq_avx(auVar226,auVar118);
            auVar208._0_8_ = auVar2._0_8_ ^ 0x8000000000000000;
            auVar208._8_4_ = auVar2._8_4_;
            auVar208._12_4_ = auVar2._12_4_ ^ 0x80000000;
            auVar166 = vpcmpgtq_avx(auVar208,auVar110);
            auVar154 = vpackssdw_avx(auVar166,auVar154);
            auVar227._0_8_ = auVar200._16_8_ ^ 0x8000000000000000;
            auVar227._8_4_ = auVar200._24_4_;
            auVar227._12_4_ = auVar200._28_4_ ^ 0x80000000;
            auVar166 = vpcmpgtq_avx(auVar227,auVar118);
            auVar219._0_8_ = auVar200._0_8_ ^ 0x8000000000000000;
            auVar219._8_4_ = auVar200._8_4_;
            auVar219._12_4_ = auVar200._12_4_ ^ 0x80000000;
            auVar23 = vpcmpgtq_avx(auVar219,auVar147);
            auVar166 = vpackssdw_avx(auVar23,auVar166);
            auVar154 = vpackssdw_avx(auVar166 ^ auVar97,auVar154 ^ auVar97);
            auVar166 = vpmovsxwd_avx(auVar154);
            auVar154 = vpunpckhwd_avx(auVar154,auVar154);
            auVar216._16_16_ = auVar154;
            auVar216._0_16_ = auVar166;
            auVar200 = vmaskmovps_avx(auVar216,*(undefined1 (*) [32])(*pauVar15 + uVar17 * 4));
            auVar200 = vandps_avx(auVar200,auVar162);
            auVar200 = vmaskmovps_avx(auVar216,auVar200);
            *(undefined1 (*) [32])(*pauVar15 + uVar17 * 4) = auVar200;
            uVar17 = uVar17 + 8;
          } while ((uVar12 + 8 & 0x1fffffff8) != uVar17);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar10);
    }
    break;
  case 1:
    iVar10 = bottom_top_blob->c;
    if (0 < (long)iVar10) {
      uVar21 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      auVar143._8_8_ = 0x8000000000000000;
      auVar143._0_8_ = 0x8000000000000000;
      auVar97 = vpcmpeqd_avx(auVar118,auVar118);
      do {
        pauVar15 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar21 < 8) {
          uVar11 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar200 = *pauVar15;
            auVar164._0_8_ = auVar200._0_8_ ^ 0x8000000080000000;
            auVar164._8_4_ = auVar200._8_4_ ^ 0x80000000;
            auVar164._12_4_ = auVar200._12_4_ ^ 0x80000000;
            auVar164._16_4_ = auVar200._16_4_ ^ 0x80000000;
            auVar164._20_4_ = auVar200._20_4_ ^ 0x80000000;
            auVar164._24_4_ = auVar200._24_4_ ^ 0x80000000;
            auVar164._28_4_ = auVar200._28_4_ ^ 0x80000000;
            *pauVar15 = auVar164;
            pauVar15 = pauVar15 + 1;
            iVar16 = iVar16 + 8;
            uVar11 = uVar21 & 0xfffffff8;
          } while (iVar16 < (int)uVar21);
        }
        uVar13 = uVar11 | 3;
        while ((int)uVar13 < (int)uVar21) {
          auVar118 = *(undefined1 (*) [16])*pauVar15;
          auVar158._0_8_ = auVar118._0_8_ ^ 0x8000000080000000;
          auVar158._8_4_ = auVar118._8_4_ ^ 0x80000000;
          auVar158._12_4_ = auVar118._12_4_ ^ 0x80000000;
          *(undefined1 (*) [16])*pauVar15 = auVar158;
          pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
          uVar13 = uVar11 + 7;
          uVar11 = uVar11 + 4;
        }
        if ((int)uVar11 < (int)uVar21) {
          uVar12 = CONCAT44(0,~uVar11 + uVar21);
          auVar159._8_8_ = 0;
          auVar159._0_8_ = uVar12;
          auVar147 = vpshufd_avx(auVar159,0x44);
          auVar118 = vorps_avx(auVar147,auVar143);
          auVar110 = vorps_avx(auVar147,auVar143);
          auVar147 = vorps_avx(auVar147,auVar143);
          uVar17 = 0;
          do {
            auVar195._8_8_ = 0;
            auVar195._0_8_ = uVar17;
            auVar154 = vpshufd_avx(auVar195,0x44);
            auVar203._16_16_ = auVar154;
            auVar203._0_16_ = auVar154;
            auVar200 = vorps_avx(auVar203,auVar113);
            auVar2 = vorps_avx(auVar203,auVar128);
            auVar222._0_8_ = auVar2._16_8_ ^ 0x8000000000000000;
            auVar222._8_4_ = auVar2._24_4_;
            auVar222._12_4_ = auVar2._28_4_ ^ 0x80000000;
            auVar154 = vpcmpgtq_avx(auVar222,auVar118);
            auVar196._0_8_ = auVar2._0_8_ ^ 0x8000000000000000;
            auVar196._8_4_ = auVar2._8_4_;
            auVar196._12_4_ = auVar2._12_4_ ^ 0x80000000;
            auVar166 = vpcmpgtq_avx(auVar196,auVar110);
            auVar154 = vpackssdw_avx(auVar166,auVar154);
            auVar223._0_8_ = auVar200._16_8_ ^ 0x8000000000000000;
            auVar223._8_4_ = auVar200._24_4_;
            auVar223._12_4_ = auVar200._28_4_ ^ 0x80000000;
            auVar166 = vpcmpgtq_avx(auVar223,auVar118);
            auVar211._0_8_ = auVar200._0_8_ ^ 0x8000000000000000;
            auVar211._8_4_ = auVar200._8_4_;
            auVar211._12_4_ = auVar200._12_4_ ^ 0x80000000;
            auVar23 = vpcmpgtq_avx(auVar211,auVar147);
            auVar166 = vpackssdw_avx(auVar23,auVar166);
            auVar154 = vpackssdw_avx(auVar166 ^ auVar97,auVar154 ^ auVar97);
            auVar166 = vpmovsxwd_avx(auVar154);
            auVar154 = vpunpckhwd_avx(auVar154,auVar154);
            auVar204._16_16_ = auVar154;
            auVar204._0_16_ = auVar166;
            auVar200 = vmaskmovps_avx(auVar204,*(undefined1 (*) [32])(*pauVar15 + uVar17 * 4));
            auVar218._0_8_ = auVar200._0_8_ ^ 0x8000000080000000;
            auVar218._8_4_ = auVar200._8_4_ ^ 0x80000000;
            auVar218._12_4_ = auVar200._12_4_ ^ 0x80000000;
            auVar218._16_4_ = auVar200._16_4_ ^ 0x80000000;
            auVar218._20_4_ = auVar200._20_4_ ^ 0x80000000;
            auVar218._24_4_ = auVar200._24_4_ ^ 0x80000000;
            auVar218._28_4_ = auVar200._28_4_ ^ 0x80000000;
            auVar200 = vmaskmovps_avx(auVar204,auVar218);
            *(undefined1 (*) [32])(*pauVar15 + uVar17 * 4) = auVar200;
            uVar17 = uVar17 + 8;
          } while ((uVar12 + 8 & 0x1fffffff8) != uVar17);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar10);
    }
    break;
  case 2:
    iVar10 = bottom_top_blob->c;
    if (0 < (long)iVar10) {
      uVar21 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      auVar123._8_8_ = 0x8000000000000000;
      auVar123._0_8_ = 0x8000000000000000;
      auVar97 = vpcmpeqd_avx(auVar97,auVar97);
      do {
        pauVar15 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar21 < 8) {
          uVar11 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar200 = vroundps_avx(*pauVar15,1);
            *pauVar15 = auVar200;
            pauVar15 = pauVar15 + 1;
            iVar16 = iVar16 + 8;
            uVar11 = uVar21 & 0xfffffff8;
          } while (iVar16 < (int)uVar21);
        }
        uVar13 = uVar11 | 3;
        while ((int)uVar13 < (int)uVar21) {
          auVar118 = vroundps_avx(*(undefined1 (*) [16])*pauVar15,1);
          *(undefined1 (*) [16])*pauVar15 = auVar118;
          pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
          uVar13 = uVar11 + 7;
          uVar11 = uVar11 + 4;
        }
        if ((int)uVar11 < (int)uVar21) {
          uVar12 = CONCAT44(0,~uVar11 + uVar21);
          auVar139._8_8_ = 0;
          auVar139._0_8_ = uVar12;
          auVar147 = vpshufd_avx(auVar139,0x44);
          auVar118 = vorps_avx(auVar147,auVar123);
          auVar110 = vorps_avx(auVar147,auVar123);
          auVar147 = vorps_avx(auVar147,auVar123);
          uVar17 = 0;
          do {
            auVar169._8_8_ = 0;
            auVar169._0_8_ = uVar17;
            auVar154 = vpshufd_avx(auVar169,0x44);
            auVar176._16_16_ = auVar154;
            auVar176._0_16_ = auVar154;
            auVar200 = vorps_avx(auVar176,auVar113);
            auVar2 = vorps_avx(auVar176,auVar128);
            auVar189._0_8_ = auVar2._16_8_ ^ 0x8000000000000000;
            auVar189._8_4_ = auVar2._24_4_;
            auVar189._12_4_ = auVar2._28_4_ ^ 0x80000000;
            auVar154 = vpcmpgtq_avx(auVar189,auVar118);
            auVar170._0_8_ = auVar2._0_8_ ^ 0x8000000000000000;
            auVar170._8_4_ = auVar2._8_4_;
            auVar170._12_4_ = auVar2._12_4_ ^ 0x80000000;
            auVar166 = vpcmpgtq_avx(auVar170,auVar110);
            auVar154 = vpackssdw_avx(auVar166,auVar154);
            auVar190._0_8_ = auVar200._16_8_ ^ 0x8000000000000000;
            auVar190._8_4_ = auVar200._24_4_;
            auVar190._12_4_ = auVar200._28_4_ ^ 0x80000000;
            auVar166 = vpcmpgtq_avx(auVar190,auVar118);
            auVar181._0_8_ = auVar200._0_8_ ^ 0x8000000000000000;
            auVar181._8_4_ = auVar200._8_4_;
            auVar181._12_4_ = auVar200._12_4_ ^ 0x80000000;
            auVar23 = vpcmpgtq_avx(auVar181,auVar147);
            auVar166 = vpackssdw_avx(auVar23,auVar166);
            auVar154 = vpackssdw_avx(auVar166 ^ auVar97,auVar154 ^ auVar97);
            auVar166 = vpmovsxwd_avx(auVar154);
            auVar154 = vpunpckhwd_avx(auVar154,auVar154);
            auVar177._16_16_ = auVar154;
            auVar177._0_16_ = auVar166;
            auVar200 = vmaskmovps_avx(auVar177,*(undefined1 (*) [32])(*pauVar15 + uVar17 * 4));
            auVar200 = vroundps_avx(auVar200,9);
            auVar200 = vmaskmovps_avx(auVar177,auVar200);
            *(undefined1 (*) [32])(*pauVar15 + uVar17 * 4) = auVar200;
            uVar17 = uVar17 + 8;
          } while ((uVar12 + 8 & 0x1fffffff8) != uVar17);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar10);
    }
    break;
  case 3:
    iVar10 = bottom_top_blob->c;
    if (0 < (long)iVar10) {
      uVar21 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      auVar124._8_8_ = 0x8000000000000000;
      auVar124._0_8_ = 0x8000000000000000;
      auVar97 = vpcmpeqd_avx(auVar97,auVar97);
      do {
        pauVar15 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar21 < 8) {
          uVar11 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar200 = vroundps_avx(*pauVar15,2);
            *pauVar15 = auVar200;
            pauVar15 = pauVar15 + 1;
            iVar16 = iVar16 + 8;
            uVar11 = uVar21 & 0xfffffff8;
          } while (iVar16 < (int)uVar21);
        }
        uVar13 = uVar11 | 3;
        while ((int)uVar13 < (int)uVar21) {
          auVar118 = vroundps_avx(*(undefined1 (*) [16])*pauVar15,2);
          *(undefined1 (*) [16])*pauVar15 = auVar118;
          pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
          uVar13 = uVar11 + 7;
          uVar11 = uVar11 + 4;
        }
        if ((int)uVar11 < (int)uVar21) {
          uVar12 = CONCAT44(0,~uVar11 + uVar21);
          auVar141._8_8_ = 0;
          auVar141._0_8_ = uVar12;
          auVar147 = vpshufd_avx(auVar141,0x44);
          auVar118 = vorps_avx(auVar147,auVar124);
          auVar110 = vorps_avx(auVar147,auVar124);
          auVar147 = vorps_avx(auVar147,auVar124);
          uVar17 = 0;
          do {
            auVar171._8_8_ = 0;
            auVar171._0_8_ = uVar17;
            auVar154 = vpshufd_avx(auVar171,0x44);
            auVar178._16_16_ = auVar154;
            auVar178._0_16_ = auVar154;
            auVar200 = vorps_avx(auVar178,auVar113);
            auVar2 = vorps_avx(auVar178,auVar128);
            auVar193._0_8_ = auVar2._16_8_ ^ 0x8000000000000000;
            auVar193._8_4_ = auVar2._24_4_;
            auVar193._12_4_ = auVar2._28_4_ ^ 0x80000000;
            auVar154 = vpcmpgtq_avx(auVar193,auVar118);
            auVar172._0_8_ = auVar2._0_8_ ^ 0x8000000000000000;
            auVar172._8_4_ = auVar2._8_4_;
            auVar172._12_4_ = auVar2._12_4_ ^ 0x80000000;
            auVar166 = vpcmpgtq_avx(auVar172,auVar110);
            auVar154 = vpackssdw_avx(auVar166,auVar154);
            auVar194._0_8_ = auVar200._16_8_ ^ 0x8000000000000000;
            auVar194._8_4_ = auVar200._24_4_;
            auVar194._12_4_ = auVar200._28_4_ ^ 0x80000000;
            auVar166 = vpcmpgtq_avx(auVar194,auVar118);
            auVar182._0_8_ = auVar200._0_8_ ^ 0x8000000000000000;
            auVar182._8_4_ = auVar200._8_4_;
            auVar182._12_4_ = auVar200._12_4_ ^ 0x80000000;
            auVar23 = vpcmpgtq_avx(auVar182,auVar147);
            auVar166 = vpackssdw_avx(auVar23,auVar166);
            auVar154 = vpackssdw_avx(auVar166 ^ auVar97,auVar154 ^ auVar97);
            auVar166 = vpmovsxwd_avx(auVar154);
            auVar154 = vpunpckhwd_avx(auVar154,auVar154);
            auVar179._16_16_ = auVar154;
            auVar179._0_16_ = auVar166;
            auVar200 = vmaskmovps_avx(auVar179,*(undefined1 (*) [32])(*pauVar15 + uVar17 * 4));
            auVar200 = vroundps_avx(auVar200,10);
            auVar200 = vmaskmovps_avx(auVar179,auVar200);
            *(undefined1 (*) [32])(*pauVar15 + uVar17 * 4) = auVar200;
            uVar17 = uVar17 + 8;
          } while ((uVar12 + 8 & 0x1fffffff8) != uVar17);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar10);
    }
    break;
  case 4:
    iVar10 = bottom_top_blob->c;
    if (0 < (long)iVar10) {
      uVar21 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      auVar120._8_8_ = 0x8000000000000000;
      auVar120._0_8_ = 0x8000000000000000;
      auVar97 = vpcmpeqd_avx(auVar97,auVar97);
      do {
        pauVar15 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar21 < 8) {
          uVar11 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar3._4_4_ = *(float *)(*pauVar15 + 4) * *(float *)(*pauVar15 + 4);
            auVar3._0_4_ = *(float *)*pauVar15 * *(float *)*pauVar15;
            auVar3._8_4_ = *(float *)(*pauVar15 + 8) * *(float *)(*pauVar15 + 8);
            auVar3._12_4_ = *(float *)(*pauVar15 + 0xc) * *(float *)(*pauVar15 + 0xc);
            auVar3._16_4_ = *(float *)(*pauVar15 + 0x10) * *(float *)(*pauVar15 + 0x10);
            auVar3._20_4_ = *(float *)(*pauVar15 + 0x14) * *(float *)(*pauVar15 + 0x14);
            auVar3._24_4_ = *(float *)(*pauVar15 + 0x18) * *(float *)(*pauVar15 + 0x18);
            auVar3._28_4_ = *(undefined4 *)(*pauVar15 + 0x1c);
            *pauVar15 = auVar3;
            pauVar15 = pauVar15 + 1;
            iVar16 = iVar16 + 8;
            uVar11 = uVar21 & 0xfffffff8;
          } while (iVar16 < (int)uVar21);
        }
        uVar13 = uVar11 | 3;
        while ((int)uVar13 < (int)uVar21) {
          auVar136._0_4_ = *(float *)*pauVar15 * *(float *)*pauVar15;
          auVar136._4_4_ = *(float *)(*pauVar15 + 4) * *(float *)(*pauVar15 + 4);
          auVar136._8_4_ = *(float *)(*pauVar15 + 8) * *(float *)(*pauVar15 + 8);
          auVar136._12_4_ = *(float *)(*pauVar15 + 0xc) * *(float *)(*pauVar15 + 0xc);
          *(undefined1 (*) [16])*pauVar15 = auVar136;
          pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
          uVar13 = uVar11 + 7;
          uVar11 = uVar11 + 4;
        }
        if ((int)uVar11 < (int)uVar21) {
          uVar12 = CONCAT44(0,~uVar11 + uVar21);
          auVar137._8_8_ = 0;
          auVar137._0_8_ = uVar12;
          auVar147 = vpshufd_avx(auVar137,0x44);
          auVar118 = vorps_avx(auVar147,auVar120);
          auVar110 = vorps_avx(auVar147,auVar120);
          auVar147 = vorps_avx(auVar147,auVar120);
          uVar17 = 0;
          do {
            auVar167._8_8_ = 0;
            auVar167._0_8_ = uVar17;
            auVar154 = vpshufd_avx(auVar167,0x44);
            auVar174._16_16_ = auVar154;
            auVar174._0_16_ = auVar154;
            auVar200 = vorps_avx(auVar174,auVar113);
            auVar2 = vorps_avx(auVar174,auVar128);
            auVar187._0_8_ = auVar2._16_8_ ^ 0x8000000000000000;
            auVar187._8_4_ = auVar2._24_4_;
            auVar187._12_4_ = auVar2._28_4_ ^ 0x80000000;
            auVar154 = vpcmpgtq_avx(auVar187,auVar118);
            auVar168._0_8_ = auVar2._0_8_ ^ 0x8000000000000000;
            auVar168._8_4_ = auVar2._8_4_;
            auVar168._12_4_ = auVar2._12_4_ ^ 0x80000000;
            auVar166 = vpcmpgtq_avx(auVar168,auVar110);
            auVar154 = vpackssdw_avx(auVar166,auVar154);
            auVar188._0_8_ = auVar200._16_8_ ^ 0x8000000000000000;
            auVar188._8_4_ = auVar200._24_4_;
            auVar188._12_4_ = auVar200._28_4_ ^ 0x80000000;
            auVar166 = vpcmpgtq_avx(auVar188,auVar118);
            auVar180._0_8_ = auVar200._0_8_ ^ 0x8000000000000000;
            auVar180._8_4_ = auVar200._8_4_;
            auVar180._12_4_ = auVar200._12_4_ ^ 0x80000000;
            auVar23 = vpcmpgtq_avx(auVar180,auVar147);
            auVar166 = vpackssdw_avx(auVar23,auVar166);
            auVar154 = vpackssdw_avx(auVar166 ^ auVar97,auVar154 ^ auVar97);
            auVar166 = vpmovsxwd_avx(auVar154);
            auVar154 = vpunpckhwd_avx(auVar154,auVar154);
            auVar175._16_16_ = auVar154;
            auVar175._0_16_ = auVar166;
            auVar200 = vmaskmovps_avx(auVar175,*(undefined1 (*) [32])(*pauVar15 + uVar17 * 4));
            auVar4._4_4_ = auVar200._4_4_ * auVar200._4_4_;
            auVar4._0_4_ = auVar200._0_4_ * auVar200._0_4_;
            auVar4._8_4_ = auVar200._8_4_ * auVar200._8_4_;
            auVar4._12_4_ = auVar200._12_4_ * auVar200._12_4_;
            auVar4._16_4_ = auVar200._16_4_ * auVar200._16_4_;
            auVar4._20_4_ = auVar200._20_4_ * auVar200._20_4_;
            auVar4._24_4_ = auVar200._24_4_ * auVar200._24_4_;
            auVar4._28_4_ = auVar200._28_4_;
            auVar200 = vmaskmovps_avx(auVar175,auVar4);
            *(undefined1 (*) [32])(*pauVar15 + uVar17 * 4) = auVar200;
            uVar17 = uVar17 + 8;
          } while ((uVar12 + 8 & 0x1fffffff8) != uVar17);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar10);
    }
    break;
  case 5:
    iVar10 = bottom_top_blob->c;
    if (0 < (long)iVar10) {
      uVar21 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      auVar129._8_4_ = 0x7fffffff;
      auVar129._0_8_ = 0x7fffffff7fffffff;
      auVar129._12_4_ = 0x7fffffff;
      auVar129._16_4_ = 0x7fffffff;
      auVar129._20_4_ = 0x7fffffff;
      auVar129._24_4_ = 0x7fffffff;
      auVar129._28_4_ = 0x7fffffff;
      auVar134._8_4_ = 0x800000;
      auVar134._0_8_ = 0x80000000800000;
      auVar134._12_4_ = 0x800000;
      auVar134._16_4_ = 0x800000;
      auVar134._20_4_ = 0x800000;
      auVar134._24_4_ = 0x800000;
      auVar134._28_4_ = 0x800000;
      auVar212._8_8_ = 0x8000000000000000;
      auVar212._0_8_ = 0x8000000000000000;
      auVar97 = vpcmpeqd_avx(in_ZMM11._0_16_,in_ZMM11._0_16_);
      do {
        pauVar15 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar21 < 8) {
          uVar11 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar200 = *pauVar15;
            auVar2 = vrsqrtps_avx(auVar200);
            fVar22 = auVar200._0_4_ * auVar2._0_4_;
            fVar89 = auVar200._4_4_ * auVar2._4_4_;
            fVar90 = auVar200._8_4_ * auVar2._8_4_;
            fVar92 = auVar200._12_4_ * auVar2._12_4_;
            fVar93 = auVar200._16_4_ * auVar2._16_4_;
            fVar94 = auVar200._20_4_ * auVar2._20_4_;
            fVar95 = auVar200._24_4_ * auVar2._24_4_;
            auVar7._4_4_ = fVar89 * -0.5 * (fVar89 * auVar2._4_4_ + -3.0);
            auVar7._0_4_ = fVar22 * -0.5 * (fVar22 * auVar2._0_4_ + -3.0);
            auVar7._8_4_ = fVar90 * -0.5 * (fVar90 * auVar2._8_4_ + -3.0);
            auVar7._12_4_ = fVar92 * -0.5 * (fVar92 * auVar2._12_4_ + -3.0);
            auVar7._16_4_ = fVar93 * -0.5 * (fVar93 * auVar2._16_4_ + -3.0);
            auVar7._20_4_ = fVar94 * -0.5 * (fVar94 * auVar2._20_4_ + -3.0);
            auVar7._24_4_ = fVar95 * -0.5 * (fVar95 * auVar2._24_4_ + -3.0);
            auVar7._28_4_ = auVar2._28_4_ + -3.0;
            auVar200 = vandps_avx(auVar200,auVar129);
            auVar200 = vcmpps_avx(auVar134,auVar200,2);
            auVar200 = vandps_avx(auVar200,auVar7);
            *pauVar15 = auVar200;
            pauVar15 = pauVar15 + 1;
            iVar16 = iVar16 + 8;
            uVar11 = uVar21 & 0xfffffff8;
          } while (iVar16 < (int)uVar21);
        }
        auVar231._8_4_ = 0x800000;
        auVar231._0_8_ = 0x80000000800000;
        auVar229._8_4_ = 0x7fffffff;
        auVar229._0_8_ = 0x7fffffff7fffffff;
        auVar231._12_4_ = 0x800000;
        auVar229._12_4_ = 0x7fffffff;
        uVar13 = uVar11 | 3;
        while ((int)uVar13 < (int)uVar21) {
          auVar118 = *(undefined1 (*) [16])*pauVar15;
          auVar110 = vrsqrtps_avx(auVar118);
          fVar22 = auVar118._0_4_ * auVar110._0_4_;
          fVar89 = auVar118._4_4_ * auVar110._4_4_;
          fVar90 = auVar118._8_4_ * auVar110._8_4_;
          fVar92 = auVar118._12_4_ * auVar110._12_4_;
          in_ZMM6 = ZEXT1664(CONCAT412(fVar92,CONCAT48(fVar90,CONCAT44(fVar89,fVar22))));
          auVar149._0_4_ = fVar22 * -0.5 * (fVar22 * auVar110._0_4_ + -3.0);
          auVar149._4_4_ = fVar89 * -0.5 * (fVar89 * auVar110._4_4_ + -3.0);
          auVar149._8_4_ = fVar90 * -0.5 * (fVar90 * auVar110._8_4_ + -3.0);
          auVar149._12_4_ = fVar92 * -0.5 * (fVar92 * auVar110._12_4_ + -3.0);
          auVar118 = vandps_avx(auVar229,auVar118);
          auVar118 = vcmpps_avx(auVar231,auVar118,2);
          auVar118 = vandps_avx(auVar118,auVar149);
          *(undefined1 (*) [16])*pauVar15 = auVar118;
          pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
          uVar13 = uVar11 + 7;
          uVar11 = uVar11 + 4;
        }
        if ((int)uVar11 < (int)uVar21) {
          uVar12 = CONCAT44(0,~uVar11 + uVar21);
          auVar228._8_8_ = 0;
          auVar228._0_8_ = uVar12;
          auVar147 = vpshufd_avx(auVar228,0x44);
          auVar118 = vorps_avx(auVar147,auVar212);
          auVar110 = vorps_avx(auVar147,auVar212);
          auVar147 = vorps_avx(auVar147,auVar212);
          uVar17 = 0;
          do {
            auVar232._8_8_ = 0;
            auVar232._0_8_ = uVar17;
            auVar154 = vpshufd_avx(auVar232,0x44);
            auVar235._16_16_ = auVar154;
            auVar235._0_16_ = auVar154;
            auVar200 = vorps_avx(auVar235,auVar113);
            auVar2 = vorps_avx(auVar235,auVar128);
            auVar150._0_8_ = auVar2._16_8_ ^ 0x8000000000000000;
            auVar150._8_4_ = auVar2._24_4_;
            auVar150._12_4_ = auVar2._28_4_ ^ 0x80000000;
            auVar154 = vpcmpgtq_avx(auVar150,auVar118);
            auVar233._8_4_ = auVar2._8_4_;
            auVar233._0_8_ = auVar2._0_8_ ^ 0x8000000000000000;
            auVar233._12_4_ = auVar2._12_4_ ^ 0x80000000;
            auVar166 = vpcmpgtq_avx(auVar233,auVar110);
            auVar154 = vpackssdw_avx(auVar166,auVar154);
            auVar234._8_4_ = auVar200._24_4_;
            auVar234._0_8_ = auVar200._16_8_ ^ 0x8000000000000000;
            auVar234._12_4_ = auVar200._28_4_ ^ 0x80000000;
            auVar166 = vpcmpgtq_avx(auVar234,auVar118);
            auVar144._0_8_ = auVar200._0_8_ ^ 0x8000000000000000;
            auVar144._8_4_ = auVar200._8_4_;
            auVar144._12_4_ = auVar200._12_4_ ^ 0x80000000;
            auVar23 = vpcmpgtq_avx(auVar144,auVar147);
            auVar166 = vpackssdw_avx(auVar23,auVar166);
            auVar154 = vpackssdw_avx(auVar97 ^ auVar166,auVar97 ^ auVar154);
            auVar166 = vpmovsxwd_avx(auVar154);
            auVar154 = vpunpckhwd_avx(auVar154,auVar154);
            auVar146._16_16_ = auVar154;
            auVar146._0_16_ = auVar166;
            auVar2 = vmaskmovps_avx(auVar146,*(undefined1 (*) [32])(*pauVar15 + uVar17 * 4));
            auVar200 = vrsqrtps_avx(auVar2);
            fVar22 = auVar200._0_4_ * auVar2._0_4_;
            fVar89 = auVar200._4_4_ * auVar2._4_4_;
            fVar90 = auVar200._8_4_ * auVar2._8_4_;
            fVar92 = auVar200._12_4_ * auVar2._12_4_;
            fVar93 = auVar200._16_4_ * auVar2._16_4_;
            fVar94 = auVar200._20_4_ * auVar2._20_4_;
            fVar95 = auVar200._24_4_ * auVar2._24_4_;
            auVar8._4_4_ = fVar89 * -0.5 * (auVar200._4_4_ * fVar89 + -3.0);
            auVar8._0_4_ = fVar22 * -0.5 * (auVar200._0_4_ * fVar22 + -3.0);
            auVar8._8_4_ = fVar90 * -0.5 * (auVar200._8_4_ * fVar90 + -3.0);
            auVar8._12_4_ = fVar92 * -0.5 * (auVar200._12_4_ * fVar92 + -3.0);
            auVar8._16_4_ = fVar93 * -0.5 * (auVar200._16_4_ * fVar93 + -3.0);
            auVar8._20_4_ = fVar94 * -0.5 * (auVar200._20_4_ * fVar94 + -3.0);
            auVar8._24_4_ = fVar95 * -0.5 * (auVar200._24_4_ * fVar95 + -3.0);
            auVar8._28_4_ = in_ZMM6._28_4_ + -3.0;
            in_ZMM6 = ZEXT3264(auVar8);
            auVar200 = vandps_avx(auVar2,auVar129);
            auVar200 = vcmpps_avx(auVar134,auVar200,2);
            auVar200 = vandps_avx(auVar200,auVar8);
            auVar200 = vmaskmovps_avx(auVar146,auVar200);
            *(undefined1 (*) [32])(*pauVar15 + uVar17 * 4) = auVar200;
            uVar17 = uVar17 + 8;
          } while ((uVar12 + 8 & 0x1fffffff8) != uVar17);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar10);
    }
    break;
  case 6:
    iVar10 = bottom_top_blob->c;
    if (0 < (long)iVar10) {
      uVar21 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      auVar126._8_8_ = 0x8000000000000000;
      auVar126._0_8_ = 0x8000000000000000;
      auVar97 = vpcmpeqd_avx(auVar97,auVar97);
      do {
        pauVar15 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar21 < 8) {
          uVar11 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar200 = vrsqrtps_avx(*pauVar15);
            *pauVar15 = auVar200;
            pauVar15 = pauVar15 + 1;
            iVar16 = iVar16 + 8;
            uVar11 = uVar21 & 0xfffffff8;
          } while (iVar16 < (int)uVar21);
        }
        uVar13 = uVar11 | 3;
        while ((int)uVar13 < (int)uVar21) {
          auVar118 = vrsqrtps_avx(*(undefined1 (*) [16])*pauVar15);
          *(undefined1 (*) [16])*pauVar15 = auVar118;
          pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
          uVar13 = uVar11 + 7;
          uVar11 = uVar11 + 4;
        }
        if ((int)uVar11 < (int)uVar21) {
          uVar12 = CONCAT44(0,~uVar11 + uVar21);
          auVar160._8_8_ = 0;
          auVar160._0_8_ = uVar12;
          auVar147 = vpshufd_avx(auVar160,0x44);
          auVar118 = vorps_avx(auVar147,auVar126);
          auVar110 = vorps_avx(auVar147,auVar126);
          auVar147 = vorps_avx(auVar147,auVar126);
          uVar17 = 0;
          do {
            auVar197._8_8_ = 0;
            auVar197._0_8_ = uVar17;
            auVar154 = vpshufd_avx(auVar197,0x44);
            auVar205._16_16_ = auVar154;
            auVar205._0_16_ = auVar154;
            auVar200 = vorps_avx(auVar205,auVar113);
            auVar2 = vorps_avx(auVar205,auVar128);
            auVar224._0_8_ = auVar2._16_8_ ^ 0x8000000000000000;
            auVar224._8_4_ = auVar2._24_4_;
            auVar224._12_4_ = auVar2._28_4_ ^ 0x80000000;
            auVar154 = vpcmpgtq_avx(auVar224,auVar118);
            auVar198._0_8_ = auVar2._0_8_ ^ 0x8000000000000000;
            auVar198._8_4_ = auVar2._8_4_;
            auVar198._12_4_ = auVar2._12_4_ ^ 0x80000000;
            auVar166 = vpcmpgtq_avx(auVar198,auVar110);
            auVar154 = vpackssdw_avx(auVar166,auVar154);
            auVar225._0_8_ = auVar200._16_8_ ^ 0x8000000000000000;
            auVar225._8_4_ = auVar200._24_4_;
            auVar225._12_4_ = auVar200._28_4_ ^ 0x80000000;
            auVar166 = vpcmpgtq_avx(auVar225,auVar118);
            auVar213._0_8_ = auVar200._0_8_ ^ 0x8000000000000000;
            auVar213._8_4_ = auVar200._8_4_;
            auVar213._12_4_ = auVar200._12_4_ ^ 0x80000000;
            auVar23 = vpcmpgtq_avx(auVar213,auVar147);
            auVar166 = vpackssdw_avx(auVar23,auVar166);
            auVar154 = vpackssdw_avx(auVar166 ^ auVar97,auVar154 ^ auVar97);
            auVar166 = vpmovsxwd_avx(auVar154);
            auVar154 = vpunpckhwd_avx(auVar154,auVar154);
            auVar206._16_16_ = auVar154;
            auVar206._0_16_ = auVar166;
            auVar2 = vmaskmovps_avx(auVar206,*(undefined1 (*) [32])(*pauVar15 + uVar17 * 4));
            auVar200 = vrsqrtps_avx(auVar2);
            fVar22 = auVar200._0_4_;
            fVar89 = auVar200._4_4_;
            fVar90 = auVar200._8_4_;
            fVar92 = auVar200._12_4_;
            fVar93 = auVar200._16_4_;
            fVar94 = auVar200._20_4_;
            fVar95 = auVar200._24_4_;
            auVar9._4_4_ = fVar89 * -0.5 * (auVar2._4_4_ * fVar89 * fVar89 + -3.0);
            auVar9._0_4_ = fVar22 * -0.5 * (auVar2._0_4_ * fVar22 * fVar22 + -3.0);
            auVar9._8_4_ = fVar90 * -0.5 * (auVar2._8_4_ * fVar90 * fVar90 + -3.0);
            auVar9._12_4_ = fVar92 * -0.5 * (auVar2._12_4_ * fVar92 * fVar92 + -3.0);
            auVar9._16_4_ = fVar93 * -0.5 * (auVar2._16_4_ * fVar93 * fVar93 + -3.0);
            auVar9._20_4_ = fVar94 * -0.5 * (auVar2._20_4_ * fVar94 * fVar94 + -3.0);
            auVar9._24_4_ = fVar95 * -0.5 * (auVar2._24_4_ * fVar95 * fVar95 + -3.0);
            auVar9._28_4_ = auVar2._28_4_ + -3.0;
            auVar200 = vmaskmovps_avx(auVar206,auVar9);
            *(undefined1 (*) [32])(*pauVar15 + uVar17 * 4) = auVar200;
            uVar17 = uVar17 + 8;
          } while ((uVar12 + 8 & 0x1fffffff8) != uVar17);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar10);
    }
    break;
  case 7:
    local_128 = (ulong)bottom_top_blob->c;
    if (0 < (long)local_128) {
      iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_110 = CONCAT44(local_110._4_4_,iVar10) & 0xfffffffffffffff8;
      lVar18 = 0;
      local_120._8_8_ = 0x8000000000000000;
      local_120._0_8_ = 0x8000000000000000;
      do {
        auVar186._8_4_ = 0x3f800000;
        auVar186._0_8_ = 0x3f8000003f800000;
        auVar153._8_4_ = 0xc2b0c0a5;
        auVar153._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar145._8_4_ = 0x42b0c0a5;
        auVar145._0_8_ = 0x42b0c0a542b0c0a5;
        auVar186._12_4_ = 0x3f800000;
        auVar153._12_4_ = 0xc2b0c0a5;
        auVar145._12_4_ = 0x42b0c0a5;
        auVar186._16_4_ = 0x3f800000;
        auVar153._16_4_ = 0xc2b0c0a5;
        auVar145._16_4_ = 0x42b0c0a5;
        auVar186._20_4_ = 0x3f800000;
        auVar153._20_4_ = 0xc2b0c0a5;
        auVar145._20_4_ = 0x42b0c0a5;
        auVar230._8_4_ = 0x3f800000;
        auVar230._0_8_ = 0x3f8000003f800000;
        auVar186._24_4_ = 0x3f800000;
        auVar153._24_4_ = 0xc2b0c0a5;
        auVar145._24_4_ = 0x42b0c0a5;
        auVar230._12_4_ = 0x3f800000;
        auVar186._28_4_ = 0x3f800000;
        auVar153._28_4_ = 0xc2b0c0a5;
        auVar145._28_4_ = 0x42b0c0a5;
        pauVar15 = (undefined1 (*) [32])
                   (local_108->cstep * lVar18 * local_108->elemsize + (long)local_108->data);
        if (iVar10 < 8) {
          uVar21 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar113 = vminps_avx(auVar145,*pauVar15);
            auVar128 = vmaxps_avx(auVar113,auVar153);
            auVar116._0_4_ = auVar128._0_4_ * 1.442695 + 0.5;
            auVar116._4_4_ = auVar128._4_4_ * 1.442695 + 0.5;
            auVar116._8_4_ = auVar128._8_4_ * 1.442695 + 0.5;
            auVar116._12_4_ = auVar128._12_4_ * 1.442695 + 0.5;
            auVar116._16_4_ = auVar128._16_4_ * 1.442695 + 0.5;
            auVar116._20_4_ = auVar128._20_4_ * 1.442695 + 0.5;
            auVar116._24_4_ = auVar128._24_4_ * 1.442695 + 0.5;
            auVar116._28_4_ = in_ZMM1._28_4_ + 0.5;
            auVar200 = vroundps_avx(auVar116,1);
            auVar113 = vcmpps_avx(auVar116,auVar200,1);
            auVar113 = vandps_avx(auVar186,auVar113);
            auVar113 = vsubps_avx(auVar200,auVar113);
            fVar22 = auVar128._0_4_ + auVar113._0_4_ * -0.6931472;
            fVar89 = auVar128._4_4_ + auVar113._4_4_ * -0.6931472;
            fVar90 = auVar128._8_4_ + auVar113._8_4_ * -0.6931472;
            fVar92 = auVar128._12_4_ + auVar113._12_4_ * -0.6931472;
            fVar93 = auVar128._16_4_ + auVar113._16_4_ * -0.6931472;
            fVar94 = auVar128._20_4_ + auVar113._20_4_ * -0.6931472;
            fVar95 = auVar128._24_4_ + auVar113._24_4_ * -0.6931472;
            auVar105._0_4_ = (int)auVar113._0_4_;
            auVar105._4_4_ = (int)auVar113._4_4_;
            auVar105._8_4_ = (int)auVar113._8_4_;
            auVar105._12_4_ = (int)auVar113._12_4_;
            auVar117._16_4_ = (int)auVar113._16_4_;
            auVar117._0_16_ = auVar105;
            auVar117._20_4_ = (int)auVar113._20_4_;
            auVar117._24_4_ = (int)auVar113._24_4_;
            auVar117._28_4_ = (int)auVar113._28_4_;
            auVar118 = vpslld_avx(auVar105,0x17);
            auVar97 = vpslld_avx(auVar117._16_16_,0x17);
            auVar97 = vpaddd_avx(auVar230,auVar97);
            auVar118 = vpaddd_avx(auVar230,auVar118);
            in_ZMM1 = ZEXT3264(CONCAT1616(auVar97,auVar118));
            *(float *)*pauVar15 =
                 (fVar22 + 1.0 +
                 fVar22 * fVar22 *
                 (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 + 0.008333452) * fVar22 +
                   0.041665796) * fVar22 + 0.16666666) * fVar22 + 0.5)) * auVar118._0_4_;
            *(float *)(*pauVar15 + 4) =
                 (fVar89 + 1.0 +
                 fVar89 * fVar89 *
                 (((((fVar89 * 0.00019875691 + 0.0013981999) * fVar89 + 0.008333452) * fVar89 +
                   0.041665796) * fVar89 + 0.16666666) * fVar89 + 0.5)) * auVar118._4_4_;
            *(float *)(*pauVar15 + 8) =
                 (fVar90 + 1.0 +
                 fVar90 * fVar90 *
                 (((((fVar90 * 0.00019875691 + 0.0013981999) * fVar90 + 0.008333452) * fVar90 +
                   0.041665796) * fVar90 + 0.16666666) * fVar90 + 0.5)) * auVar118._8_4_;
            *(float *)(*pauVar15 + 0xc) =
                 (fVar92 + 1.0 +
                 fVar92 * fVar92 *
                 (((((fVar92 * 0.00019875691 + 0.0013981999) * fVar92 + 0.008333452) * fVar92 +
                   0.041665796) * fVar92 + 0.16666666) * fVar92 + 0.5)) * auVar118._12_4_;
            *(float *)(*pauVar15 + 0x10) =
                 (fVar93 + 1.0 +
                 fVar93 * fVar93 *
                 (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) * fVar93 +
                   0.041665796) * fVar93 + 0.16666666) * fVar93 + 0.5)) * auVar97._0_4_;
            *(float *)(*pauVar15 + 0x14) =
                 (fVar94 + 1.0 +
                 fVar94 * fVar94 *
                 (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) * fVar94 +
                   0.041665796) * fVar94 + 0.16666666) * fVar94 + 0.5)) * auVar97._4_4_;
            *(float *)(*pauVar15 + 0x18) =
                 (fVar95 + 1.0 +
                 fVar95 * fVar95 *
                 (((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 + 0.008333452) * fVar95 +
                   0.041665796) * fVar95 + 0.16666666) * fVar95 + 0.5)) * auVar97._8_4_;
            *(float *)(*pauVar15 + 0x1c) = auVar128._28_4_ + auVar200._28_4_ + 1.0 + auVar200._28_4_
            ;
            pauVar15 = pauVar15 + 1;
            iVar16 = iVar16 + 8;
          } while (iVar16 < iVar10);
          uVar21 = (uint)local_110;
        }
        auVar142._8_4_ = 0x42b0c0a5;
        auVar142._0_8_ = 0x42b0c0a542b0c0a5;
        auVar142._12_4_ = 0x42b0c0a5;
        auVar148._8_4_ = 0xc2b0c0a5;
        auVar148._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar148._12_4_ = 0xc2b0c0a5;
        uVar11 = uVar21 | 3;
        while ((int)uVar11 < iVar10) {
          auVar97 = vminps_avx(auVar142,*(undefined1 (*) [16])*pauVar15);
          auVar110 = vmaxps_avx(auVar97,auVar148);
          auVar106._0_4_ = auVar110._0_4_ * 1.442695 + 0.5;
          auVar106._4_4_ = auVar110._4_4_ * 1.442695 + 0.5;
          auVar106._8_4_ = auVar110._8_4_ * 1.442695 + 0.5;
          auVar106._12_4_ = auVar110._12_4_ * 1.442695 + 0.5;
          auVar125._0_4_ = (int)auVar106._0_4_;
          auVar125._4_4_ = (int)auVar106._4_4_;
          auVar125._8_4_ = (int)auVar106._8_4_;
          auVar125._12_4_ = (int)auVar106._12_4_;
          auVar118 = vcvtdq2ps_avx(auVar125);
          auVar97 = vcmpps_avx(auVar106,auVar118,1);
          auVar97 = vandps_avx(auVar230,auVar97);
          auVar97 = vsubps_avx(auVar118,auVar97);
          fVar22 = auVar110._0_4_ + auVar97._0_4_ * -0.6931472;
          fVar89 = auVar110._4_4_ + auVar97._4_4_ * -0.6931472;
          fVar90 = auVar110._8_4_ + auVar97._8_4_ * -0.6931472;
          fVar92 = auVar110._12_4_ + auVar97._12_4_ * -0.6931472;
          auVar107._0_4_ = (int)auVar97._0_4_;
          auVar107._4_4_ = (int)auVar97._4_4_;
          auVar107._8_4_ = (int)auVar97._8_4_;
          auVar107._12_4_ = (int)auVar97._12_4_;
          auVar97 = vpslld_avx(auVar107,0x17);
          auVar97 = vpaddd_avx(auVar230,auVar97);
          in_ZMM1 = ZEXT1664(auVar97);
          *(float *)*pauVar15 =
               (fVar22 + 1.0 +
               fVar22 * fVar22 *
               (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 + 0.008333452) * fVar22 +
                 0.041665796) * fVar22 + 0.16666666) * fVar22 + 0.5)) * auVar97._0_4_;
          *(float *)(*pauVar15 + 4) =
               (fVar89 + 1.0 +
               fVar89 * fVar89 *
               (((((fVar89 * 0.00019875691 + 0.0013981999) * fVar89 + 0.008333452) * fVar89 +
                 0.041665796) * fVar89 + 0.16666666) * fVar89 + 0.5)) * auVar97._4_4_;
          *(float *)(*pauVar15 + 8) =
               (fVar90 + 1.0 +
               fVar90 * fVar90 *
               (((((fVar90 * 0.00019875691 + 0.0013981999) * fVar90 + 0.008333452) * fVar90 +
                 0.041665796) * fVar90 + 0.16666666) * fVar90 + 0.5)) * auVar97._8_4_;
          *(float *)(*pauVar15 + 0xc) =
               (fVar92 + 1.0 +
               fVar92 * fVar92 *
               (((((fVar92 * 0.00019875691 + 0.0013981999) * fVar92 + 0.008333452) * fVar92 +
                 0.041665796) * fVar92 + 0.16666666) * fVar92 + 0.5)) * auVar97._12_4_;
          pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
          uVar11 = uVar21 + 7;
          uVar21 = uVar21 + 4;
        }
        auVar97 = vpcmpeqd_avx(auVar142,auVar142);
        if ((int)uVar21 < iVar10) {
          uVar12 = CONCAT44(0,~uVar21 + iVar10);
          auVar30._8_8_ = 0;
          auVar30._0_8_ = uVar12;
          local_a0._0_16_ = vpshufd_avx(auVar30,0x44);
          local_d0 = vpor_avx(local_120,local_a0._0_16_);
          local_e0 = vpor_avx(local_120,local_a0._0_16_);
          uVar17 = 0;
          auVar113 = _DAT_0055d1e0;
          local_a0._16_16_ = local_a0._0_16_;
          do {
            auVar31._8_8_ = 0;
            auVar31._0_8_ = uVar17;
            auVar118 = vpshufd_avx(auVar31,0x44);
            auVar46._16_16_ = auVar118;
            auVar46._0_16_ = auVar118;
            auVar128 = vorps_avx(auVar46,_DAT_0055d1c0);
            auVar113 = vorps_avx(auVar46,auVar113);
            auVar147 = vpor_avx(local_120,local_a0._16_16_);
            auVar118 = vpcmpgtq_avx(local_120 ^ auVar113._16_16_,auVar147);
            auVar110 = vpcmpgtq_avx(local_120 ^ auVar113._0_16_,local_d0);
            auVar118 = vpackssdw_avx(auVar110,auVar118);
            auVar110 = vpcmpgtq_avx(local_120 ^ auVar128._16_16_,auVar147);
            auVar108._0_4_ = local_120._0_4_ ^ auVar128._0_4_;
            auVar108._4_4_ = local_120._4_4_ ^ auVar128._4_4_;
            auVar108._8_4_ = local_120._8_4_ ^ auVar128._8_4_;
            auVar108._12_4_ = local_120._12_4_ ^ auVar128._12_4_;
            auVar147 = vpcmpgtq_avx(auVar108,local_e0);
            auVar110 = vpackssdw_avx(auVar147,auVar110);
            auVar118 = vpackssdw_avx(auVar110 ^ auVar97,auVar118 ^ auVar97);
            auVar110 = vpmovsxwd_avx(auVar118);
            auVar118 = vpunpckhwd_avx(auVar118,auVar118);
            local_c0._16_16_ = auVar118;
            local_c0._0_16_ = auVar110;
            local_100 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(*pauVar15 + uVar17 * 4));
            _local_140 = local_100._16_16_;
            local_150._0_4_ = expf(local_100._16_4_);
            local_150._4_4_ = extraout_XMM0_Db_23;
            local_150._8_4_ = extraout_XMM0_Dc_23;
            local_150._12_4_ = extraout_XMM0_Dd_23;
            auVar118 = vmovshdup_avx(_local_140);
            auVar69._0_4_ = expf(auVar118._0_4_);
            auVar69._4_60_ = extraout_var_15;
            local_150 = vinsertps_avx(local_150,auVar69._0_16_,0x10);
            auVar118 = vpermilpd_avx(_local_140,1);
            auVar70._0_4_ = expf(auVar118._0_4_);
            auVar70._4_60_ = extraout_var_16;
            local_150 = vinsertps_avx(local_150,auVar70._0_16_,0x20);
            auVar118 = vpermilps_avx(_local_140,0xff);
            auVar71._0_4_ = expf(auVar118._0_4_);
            auVar71._4_60_ = extraout_var_17;
            _local_140 = vinsertps_avx(local_150,auVar71._0_16_,0x30);
            local_150._0_4_ = expf((float)local_100._0_4_);
            local_150._4_4_ = extraout_XMM0_Db_24;
            local_150._8_4_ = extraout_XMM0_Dc_24;
            local_150._12_4_ = extraout_XMM0_Dd_24;
            auVar118 = vmovshdup_avx(local_100._0_16_);
            auVar72._0_4_ = expf(auVar118._0_4_);
            auVar72._4_60_ = extraout_var_18;
            local_150 = vinsertps_avx(local_150,auVar72._0_16_,0x10);
            auVar118 = vpermilpd_avx(local_100._0_16_,1);
            auVar73._0_4_ = expf(auVar118._0_4_);
            auVar73._4_60_ = extraout_var_19;
            local_150 = vinsertps_avx(local_150,auVar73._0_16_,0x20);
            auVar118 = vpermilps_avx(local_100._0_16_,0xff);
            auVar74._0_4_ = expf(auVar118._0_4_);
            auVar113 = _DAT_0055d1e0;
            auVar74._4_60_ = extraout_var_20;
            auVar97 = vpcmpeqd_avx(auVar97,auVar97);
            auVar118 = vinsertps_avx(local_150,auVar74._0_16_,0x30);
            auVar47._16_16_ = _local_140;
            auVar47._0_16_ = auVar118;
            in_ZMM1 = ZEXT3264(local_c0);
            auVar128 = vmaskmovps_avx(local_c0,auVar47);
            *(undefined1 (*) [32])(*pauVar15 + uVar17 * 4) = auVar128;
            uVar17 = uVar17 + 8;
          } while ((uVar12 + 8 & 0x1fffffff8) != uVar17);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != local_128);
    }
    break;
  case 8:
    local_110 = (ulong)bottom_top_blob->c;
    if (0 < (long)local_110) {
      iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_128 = 0;
      local_120._8_8_ = 0x8000000000000000;
      local_120._0_8_ = 0x8000000000000000;
      do {
        pfVar19 = (float *)(local_108->cstep * local_128 * local_108->elemsize +
                           (long)local_108->data);
        if (iVar10 < 8) {
          uVar21 = 0;
        }
        else {
          uVar11 = 0;
          do {
            local_80 = *(undefined1 (*) [32])pfVar19;
            UnaryOp_x86_avx_functor::unary_op_log::func_pack8
                      ((unary_op_log *)&local_151,(__m256 *)local_80);
            *(undefined1 (*) [32])pfVar19 = local_80;
            pfVar19 = pfVar19 + 8;
            uVar21 = uVar11 + 8;
            iVar16 = uVar11 + 0xf;
            uVar11 = uVar21;
          } while (iVar16 < iVar10);
        }
        auVar161._8_4_ = 0x3f000000;
        auVar161._0_8_ = 0x3f0000003f000000;
        auVar161._12_4_ = 0x3f000000;
        auVar173._8_4_ = 0xffffff82;
        auVar173._0_8_ = 0xffffff82ffffff82;
        auVar173._12_4_ = 0xffffff82;
        auVar184._8_4_ = 0x3f3504f3;
        auVar184._0_8_ = 0x3f3504f33f3504f3;
        auVar184._12_4_ = 0x3f3504f3;
        auVar214._8_4_ = 0x3f800000;
        auVar214._0_8_ = 0x3f8000003f800000;
        auVar214._12_4_ = 0x3f800000;
        auVar152._8_4_ = 0x3e4cceac;
        auVar152._0_8_ = 0x3e4cceac3e4cceac;
        auVar152._12_4_ = 0x3e4cceac;
        uVar11 = uVar21 | 3;
        while ((int)uVar11 < iVar10) {
          auVar36._8_4_ = 0x800000;
          auVar36._0_8_ = 0x80000000800000;
          auVar36._12_4_ = 0x800000;
          auVar97 = vmaxps_avx(auVar36,*(undefined1 (*) [16])pfVar19);
          auVar118 = vpsrld_avx(auVar97,0x17);
          auVar118 = vpaddd_avx(auVar118,auVar173);
          auVar127._8_4_ = 0x807fffff;
          auVar127._0_8_ = 0x807fffff807fffff;
          auVar127._12_4_ = 0x807fffff;
          auVar97 = vandps_avx(auVar97,auVar127);
          auVar147 = vorps_avx(auVar97,auVar161);
          auVar110 = vcvtdq2ps_avx(auVar118);
          auVar118 = vcmpps_avx(auVar147,auVar184,1);
          auVar97 = vandps_avx(auVar118,auVar147);
          fVar22 = auVar147._0_4_ + -1.0 + auVar97._0_4_;
          fVar89 = auVar147._4_4_ + -1.0 + auVar97._4_4_;
          fVar90 = auVar147._8_4_ + -1.0 + auVar97._8_4_;
          fVar92 = auVar147._12_4_ + -1.0 + auVar97._12_4_;
          auVar97 = vandps_avx(auVar214,auVar118);
          auVar97 = vsubps_avx(auVar110,auVar97);
          auVar37._0_4_ =
               auVar97._0_4_ * 0.6931472 + fVar22 +
               fVar22 * fVar22 *
               (((((((((fVar22 * 0.070376836 + -0.1151461) * fVar22 + 0.116769984) * fVar22 +
                     -0.12420141) * fVar22 + 0.14249323) * fVar22 + -0.16668057) * fVar22 +
                  0.20000714) * fVar22 + -0.24999994) * fVar22 + 0.3333333) * fVar22 + -0.5);
          auVar37._4_4_ =
               auVar97._4_4_ * 0.6931472 + fVar89 +
               fVar89 * fVar89 *
               (((((((((fVar89 * 0.070376836 + -0.1151461) * fVar89 + 0.116769984) * fVar89 +
                     -0.12420141) * fVar89 + 0.14249323) * fVar89 + -0.16668057) * fVar89 +
                  0.20000714) * fVar89 + -0.24999994) * fVar89 + 0.3333333) * fVar89 + -0.5);
          auVar37._8_4_ =
               auVar97._8_4_ * 0.6931472 + fVar90 +
               fVar90 * fVar90 *
               (((((((((fVar90 * 0.070376836 + -0.1151461) * fVar90 + 0.116769984) * fVar90 +
                     -0.12420141) * fVar90 + 0.14249323) * fVar90 + -0.16668057) * fVar90 +
                  0.20000714) * fVar90 + -0.24999994) * fVar90 + 0.3333333) * fVar90 + -0.5);
          auVar37._12_4_ =
               auVar97._12_4_ * 0.6931472 + fVar92 +
               fVar92 * fVar92 *
               (((((((((fVar92 * 0.070376836 + -0.1151461) * fVar92 + 0.116769984) * fVar92 +
                     -0.12420141) * fVar92 + 0.14249323) * fVar92 + -0.16668057) * fVar92 +
                  0.20000714) * fVar92 + -0.24999994) * fVar92 + 0.3333333) * fVar92 + -0.5);
          *(undefined1 (*) [16])pfVar19 = auVar37;
          pfVar19 = pfVar19 + 4;
          uVar11 = uVar21 + 7;
          uVar21 = uVar21 + 4;
        }
        auVar97 = vpcmpeqd_avx(auVar152,auVar152);
        if ((int)uVar21 < iVar10) {
          uVar12 = CONCAT44(0,~uVar21 + iVar10);
          auVar38._8_8_ = 0;
          auVar38._0_8_ = uVar12;
          auVar118 = vpshufd_avx(auVar38,0x44);
          local_a0._16_16_ = auVar118;
          local_a0._0_16_ = auVar118;
          local_d0 = vpor_avx(auVar118,local_120);
          local_e0 = vpor_avx(auVar118,local_120);
          uVar17 = 0;
          auVar113 = _DAT_0055d1e0;
          do {
            auVar39._8_8_ = 0;
            auVar39._0_8_ = uVar17;
            auVar118 = vpshufd_avx(auVar39,0x44);
            auVar50._16_16_ = auVar118;
            auVar50._0_16_ = auVar118;
            auVar128 = vorps_avx(auVar50,_DAT_0055d1c0);
            auVar113 = vorps_avx(auVar50,auVar113);
            auVar147 = vpor_avx(local_a0._16_16_,local_120);
            auVar118 = vpcmpgtq_avx(auVar113._16_16_ ^ local_120,auVar147);
            auVar110 = vpcmpgtq_avx(auVar113._0_16_ ^ local_120,local_d0);
            auVar118 = vpackssdw_avx(auVar110,auVar118);
            auVar110 = vpcmpgtq_avx(auVar128._16_16_ ^ local_120,auVar147);
            auVar112._0_4_ = auVar128._0_4_ ^ local_120._0_4_;
            auVar112._4_4_ = auVar128._4_4_ ^ local_120._4_4_;
            auVar112._8_4_ = auVar128._8_4_ ^ local_120._8_4_;
            auVar112._12_4_ = auVar128._12_4_ ^ local_120._12_4_;
            auVar147 = vpcmpgtq_avx(auVar112,local_e0);
            auVar110 = vpackssdw_avx(auVar147,auVar110);
            auVar118 = vpackssdw_avx(auVar110 ^ auVar97,auVar118 ^ auVar97);
            auVar110 = vpmovsxwd_avx(auVar118);
            auVar118 = vpunpckhwd_avx(auVar118,auVar118);
            local_c0._16_16_ = auVar118;
            local_c0._0_16_ = auVar110;
            local_100 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(pfVar19 + uVar17));
            _local_140 = local_100._16_16_;
            local_150._0_4_ = logf(local_100._16_4_);
            local_150._4_4_ = extraout_XMM0_Db_37;
            local_150._8_4_ = extraout_XMM0_Dc_37;
            local_150._12_4_ = extraout_XMM0_Dd_37;
            auVar118 = vmovshdup_avx(_local_140);
            auVar83._0_4_ = logf(auVar118._0_4_);
            auVar83._4_60_ = extraout_var_29;
            local_150 = vinsertps_avx(local_150,auVar83._0_16_,0x10);
            auVar118 = vpermilpd_avx(_local_140,1);
            auVar84._0_4_ = logf(auVar118._0_4_);
            auVar84._4_60_ = extraout_var_30;
            local_150 = vinsertps_avx(local_150,auVar84._0_16_,0x20);
            auVar118 = vpermilps_avx(_local_140,0xff);
            auVar85._0_4_ = logf(auVar118._0_4_);
            auVar85._4_60_ = extraout_var_31;
            _local_140 = vinsertps_avx(local_150,auVar85._0_16_,0x30);
            local_150._0_4_ = logf((float)local_100._0_4_);
            local_150._4_4_ = extraout_XMM0_Db_38;
            local_150._8_4_ = extraout_XMM0_Dc_38;
            local_150._12_4_ = extraout_XMM0_Dd_38;
            auVar118 = vmovshdup_avx(local_100._0_16_);
            auVar86._0_4_ = logf(auVar118._0_4_);
            auVar86._4_60_ = extraout_var_32;
            local_150 = vinsertps_avx(local_150,auVar86._0_16_,0x10);
            auVar118 = vpermilpd_avx(local_100._0_16_,1);
            auVar87._0_4_ = logf(auVar118._0_4_);
            auVar87._4_60_ = extraout_var_33;
            local_150 = vinsertps_avx(local_150,auVar87._0_16_,0x20);
            auVar118 = vpermilps_avx(local_100._0_16_,0xff);
            auVar88._0_4_ = logf(auVar118._0_4_);
            auVar113 = _DAT_0055d1e0;
            auVar88._4_60_ = extraout_var_34;
            auVar97 = vpcmpeqd_avx(auVar97,auVar97);
            auVar118 = vinsertps_avx(local_150,auVar88._0_16_,0x30);
            auVar51._16_16_ = _local_140;
            auVar51._0_16_ = auVar118;
            auVar128 = vmaskmovps_avx(local_c0,auVar51);
            *(undefined1 (*) [32])(pfVar19 + uVar17) = auVar128;
            uVar17 = uVar17 + 8;
          } while ((uVar12 + 8 & 0x1fffffff8) != uVar17);
        }
        local_128 = local_128 + 1;
      } while (local_128 != local_110);
    }
    break;
  case 9:
    local_110 = (ulong)bottom_top_blob->c;
    if (0 < (long)local_110) {
      iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_128 = 0;
      local_120._8_8_ = 0x8000000000000000;
      local_120._0_8_ = 0x8000000000000000;
      do {
        auVar97 = in_ZMM8._0_16_;
        pfVar19 = (float *)(local_108->cstep * local_128 * local_108->elemsize +
                           (long)local_108->data);
        if (iVar10 < 8) {
          uVar21 = 0;
        }
        else {
          uVar11 = 0;
          do {
            local_80 = *(undefined1 (*) [32])pfVar19;
            UnaryOp_x86_avx_functor::unary_op_sin::func_pack8
                      ((unary_op_sin *)&local_151,(__m256 *)local_80);
            auVar97 = in_ZMM8._0_16_;
            *(undefined1 (*) [32])pfVar19 = local_80;
            pfVar19 = pfVar19 + 8;
            uVar21 = uVar11 + 8;
            iVar16 = uVar11 + 0xf;
            uVar11 = uVar21;
          } while (iVar16 < iVar10);
        }
        uVar11 = uVar21 | 3;
        auVar97 = vpcmpeqd_avx(auVar97,auVar97);
        in_ZMM8 = ZEXT1664(auVar97);
        auVar209._8_4_ = 2;
        auVar209._0_8_ = 0x200000002;
        auVar209._12_4_ = 2;
        while ((int)uVar11 < iVar10) {
          auVar101._8_4_ = 0x7fffffff;
          auVar101._0_8_ = 0x7fffffff7fffffff;
          auVar101._12_4_ = 0x7fffffff;
          auVar118 = vandps_avx(*(undefined1 (*) [16])pfVar19,auVar101);
          auVar121._0_4_ = (int)(auVar118._0_4_ * 1.2732395);
          auVar121._4_4_ = (int)(auVar118._4_4_ * 1.2732395);
          auVar121._8_4_ = (int)(auVar118._8_4_ * 1.2732395);
          auVar121._12_4_ = (int)(auVar118._12_4_ * 1.2732395);
          auVar147 = vpsubd_avx(auVar121,auVar97);
          auVar131._8_4_ = 0xfffffffe;
          auVar131._0_8_ = 0xfffffffefffffffe;
          auVar131._12_4_ = 0xfffffffe;
          auVar110 = vpand_avx(auVar147,auVar131);
          auVar110 = vcvtdq2ps_avx(auVar110);
          fVar22 = auVar118._0_4_ + auVar110._0_4_ * -0.7853982;
          fVar89 = auVar118._4_4_ + auVar110._4_4_ * -0.7853982;
          fVar90 = auVar118._8_4_ + auVar110._8_4_ * -0.7853982;
          fVar92 = auVar118._12_4_ + auVar110._12_4_ * -0.7853982;
          fVar93 = fVar22 * fVar22;
          fVar94 = fVar89 * fVar89;
          fVar95 = fVar90 * fVar90;
          fVar130 = fVar92 * fVar92;
          auVar102._0_4_ =
               fVar93 * fVar22 * ((fVar93 * -0.00019515296 + 0.008332161) * fVar93 + -0.16666655) +
               fVar22;
          auVar102._4_4_ =
               fVar94 * fVar89 * ((fVar94 * -0.00019515296 + 0.008332161) * fVar94 + -0.16666655) +
               fVar89;
          auVar102._8_4_ =
               fVar95 * fVar90 * ((fVar95 * -0.00019515296 + 0.008332161) * fVar95 + -0.16666655) +
               fVar90;
          auVar102._12_4_ =
               fVar130 * fVar92 * ((fVar130 * -0.00019515296 + 0.008332161) * fVar130 + -0.16666655)
               + fVar92;
          auVar118 = vpand_avx(auVar209,auVar147);
          auVar118 = vpcmpeqd_avx(auVar118,_DAT_0055f840);
          auVar138._0_4_ =
               (((fVar93 * 2.4433157e-05 + -0.0013887316) * fVar93 + 0.041666646) * fVar93 + -0.5) *
               fVar93 + 1.0;
          auVar138._4_4_ =
               (((fVar94 * 2.4433157e-05 + -0.0013887316) * fVar94 + 0.041666646) * fVar94 + -0.5) *
               fVar94 + 1.0;
          auVar138._8_4_ =
               (((fVar95 * 2.4433157e-05 + -0.0013887316) * fVar95 + 0.041666646) * fVar95 + -0.5) *
               fVar95 + 1.0;
          auVar138._12_4_ =
               (((fVar130 * 2.4433157e-05 + -0.0013887316) * fVar130 + 0.041666646) * fVar130 + -0.5
               ) * fVar130 + 1.0;
          auVar118 = vblendvps_avx(auVar138,auVar102,auVar118);
          auVar110 = vpslld_avx(auVar147,0x1d);
          auVar122._8_4_ = 0x80000000;
          auVar122._0_8_ = 0x8000000080000000;
          auVar122._12_4_ = 0x80000000;
          auVar110 = vpand_avx(auVar110 ^ *(undefined1 (*) [16])pfVar19,auVar122);
          *(undefined1 (*) [16])pfVar19 = auVar110 ^ auVar118;
          pfVar19 = pfVar19 + 4;
          uVar11 = uVar21 + 7;
          uVar21 = uVar21 + 4;
        }
        if ((int)uVar21 < iVar10) {
          uVar12 = CONCAT44(0,~uVar21 + iVar10);
          auVar28._8_8_ = 0;
          auVar28._0_8_ = uVar12;
          auVar97 = vpshufd_avx(auVar28,0x44);
          local_a0._16_16_ = auVar97;
          local_a0._0_16_ = auVar97;
          local_d0 = vpor_avx(auVar97,local_120);
          local_e0 = vpor_avx(auVar97,local_120);
          uVar17 = 0;
          auVar113 = _DAT_0055d1e0;
          do {
            auVar29._8_8_ = 0;
            auVar29._0_8_ = uVar17;
            auVar97 = vpshufd_avx(auVar29,0x44);
            auVar43._16_16_ = auVar97;
            auVar43._0_16_ = auVar97;
            auVar128 = vorps_avx(auVar43,_DAT_0055d1c0);
            auVar113 = vorps_avx(auVar43,auVar113);
            auVar110 = vpor_avx(local_a0._16_16_,local_120);
            auVar97 = vpcmpgtq_avx(auVar113._16_16_ ^ local_120,auVar110);
            auVar118 = vpcmpgtq_avx(auVar113._0_16_ ^ local_120,local_d0);
            auVar97 = vpackssdw_avx(auVar118,auVar97);
            auVar147 = in_ZMM8._0_16_;
            auVar118 = vpcmpgtq_avx(auVar128._16_16_ ^ local_120,auVar110);
            auVar103._0_4_ = auVar128._0_4_ ^ local_120._0_4_;
            auVar103._4_4_ = auVar128._4_4_ ^ local_120._4_4_;
            auVar103._8_4_ = auVar128._8_4_ ^ local_120._8_4_;
            auVar103._12_4_ = auVar128._12_4_ ^ local_120._12_4_;
            auVar110 = vpcmpgtq_avx(auVar103,local_e0);
            auVar118 = vpackssdw_avx(auVar110,auVar118);
            auVar97 = vpackssdw_avx(auVar147 ^ auVar118,auVar147 ^ auVar97);
            auVar118 = vpmovsxwd_avx(auVar97);
            auVar97 = vpunpckhwd_avx(auVar97,auVar97);
            local_c0._16_16_ = auVar97;
            local_c0._0_16_ = auVar118;
            local_100 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(pfVar19 + uVar17));
            _local_140 = local_100._16_16_;
            local_150._0_4_ = sinf(local_100._16_4_);
            local_150._4_4_ = extraout_XMM0_Db_21;
            local_150._8_4_ = extraout_XMM0_Dc_21;
            local_150._12_4_ = extraout_XMM0_Dd_21;
            auVar97 = vmovshdup_avx(_local_140);
            auVar63._0_4_ = sinf(auVar97._0_4_);
            auVar63._4_60_ = extraout_var_09;
            local_150 = vinsertps_avx(local_150,auVar63._0_16_,0x10);
            auVar97 = vpermilpd_avx(_local_140,1);
            auVar64._0_4_ = sinf(auVar97._0_4_);
            auVar64._4_60_ = extraout_var_10;
            local_150 = vinsertps_avx(local_150,auVar64._0_16_,0x20);
            auVar97 = vpermilps_avx(_local_140,0xff);
            auVar65._0_4_ = sinf(auVar97._0_4_);
            auVar65._4_60_ = extraout_var_11;
            _local_140 = vinsertps_avx(local_150,auVar65._0_16_,0x30);
            local_150._0_4_ = sinf((float)local_100._0_4_);
            local_150._4_4_ = extraout_XMM0_Db_22;
            local_150._8_4_ = extraout_XMM0_Dc_22;
            local_150._12_4_ = extraout_XMM0_Dd_22;
            auVar97 = vmovshdup_avx(local_100._0_16_);
            auVar66._0_4_ = sinf(auVar97._0_4_);
            auVar66._4_60_ = extraout_var_12;
            local_150 = vinsertps_avx(local_150,auVar66._0_16_,0x10);
            auVar97 = vpermilpd_avx(local_100._0_16_,1);
            auVar67._0_4_ = sinf(auVar97._0_4_);
            auVar67._4_60_ = extraout_var_13;
            local_150 = vinsertps_avx(local_150,auVar67._0_16_,0x20);
            auVar97 = vpermilps_avx(local_100._0_16_,0xff);
            auVar68._0_4_ = sinf(auVar97._0_4_);
            auVar113 = _DAT_0055d1e0;
            auVar68._4_60_ = extraout_var_14;
            auVar97 = vpcmpeqd_avx(auVar147,auVar147);
            in_ZMM8 = ZEXT1664(auVar97);
            auVar97 = vinsertps_avx(local_150,auVar68._0_16_,0x30);
            auVar44._16_16_ = _local_140;
            auVar44._0_16_ = auVar97;
            auVar128 = vmaskmovps_avx(local_c0,auVar44);
            *(undefined1 (*) [32])(pfVar19 + uVar17) = auVar128;
            uVar17 = uVar17 + 8;
          } while ((uVar12 + 8 & 0x1fffffff8) != uVar17);
        }
        local_128 = local_128 + 1;
      } while (local_128 != local_110);
    }
    break;
  case 10:
    local_110 = (ulong)bottom_top_blob->c;
    if (0 < (long)local_110) {
      iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_128 = 0;
      local_120._8_8_ = 0x8000000000000000;
      local_120._0_8_ = 0x8000000000000000;
      do {
        auVar97 = in_ZMM7._0_16_;
        pfVar19 = (float *)(local_108->cstep * local_128 * local_108->elemsize +
                           (long)local_108->data);
        if (iVar10 < 8) {
          uVar21 = 0;
        }
        else {
          uVar11 = 0;
          do {
            local_80 = *(undefined1 (*) [32])pfVar19;
            UnaryOp_x86_avx_functor::unary_op_cos::func_pack8
                      ((unary_op_cos *)&local_151,(__m256 *)local_80);
            auVar97 = in_ZMM7._0_16_;
            *(undefined1 (*) [32])pfVar19 = local_80;
            pfVar19 = pfVar19 + 8;
            uVar21 = uVar11 + 8;
            iVar16 = uVar11 + 0xf;
            uVar11 = uVar21;
          } while (iVar16 < iVar10);
        }
        uVar11 = uVar21 | 3;
        auVar97 = vpcmpeqd_avx(auVar97,auVar97);
        in_ZMM7 = ZEXT1664(auVar97);
        auVar183._8_4_ = 0xfffffffe;
        auVar183._0_8_ = 0xfffffffefffffffe;
        auVar183._12_4_ = 0xfffffffe;
        auVar199._8_4_ = 2;
        auVar199._0_8_ = 0x200000002;
        auVar199._12_4_ = 2;
        auVar151._8_4_ = 0x80000000;
        auVar151._0_8_ = 0x8000000080000000;
        auVar151._12_4_ = 0x80000000;
        while ((int)uVar11 < iVar10) {
          auVar32._8_4_ = 0x7fffffff;
          auVar32._0_8_ = 0x7fffffff7fffffff;
          auVar32._12_4_ = 0x7fffffff;
          auVar118 = vandps_avx(auVar32,*(undefined1 (*) [16])pfVar19);
          auVar109._0_4_ = (int)(auVar118._0_4_ * 1.2732395);
          auVar109._4_4_ = (int)(auVar118._4_4_ * 1.2732395);
          auVar109._8_4_ = (int)(auVar118._8_4_ * 1.2732395);
          auVar109._12_4_ = (int)(auVar118._12_4_ * 1.2732395);
          auVar110 = vpsubd_avx(auVar109,auVar97);
          auVar147 = vpand_avx(auVar183,auVar110);
          auVar110 = vcvtdq2ps_avx(auVar147);
          fVar22 = auVar118._0_4_ + auVar110._0_4_ * -0.7853982;
          fVar89 = auVar118._4_4_ + auVar110._4_4_ * -0.7853982;
          fVar90 = auVar118._8_4_ + auVar110._8_4_ * -0.7853982;
          fVar92 = auVar118._12_4_ + auVar110._12_4_ * -0.7853982;
          fVar93 = fVar22 * fVar22;
          fVar94 = fVar89 * fVar89;
          fVar95 = fVar90 * fVar90;
          fVar130 = fVar92 * fVar92;
          auVar110 = vpaddd_avx(auVar183,auVar147);
          auVar33._0_4_ =
               fVar93 * fVar22 * ((fVar93 * -0.00019515296 + 0.008332161) * fVar93 + -0.16666655) +
               fVar22;
          auVar33._4_4_ =
               fVar94 * fVar89 * ((fVar94 * -0.00019515296 + 0.008332161) * fVar94 + -0.16666655) +
               fVar89;
          auVar33._8_4_ =
               fVar95 * fVar90 * ((fVar95 * -0.00019515296 + 0.008332161) * fVar95 + -0.16666655) +
               fVar90;
          auVar33._12_4_ =
               fVar130 * fVar92 * ((fVar130 * -0.00019515296 + 0.008332161) * fVar130 + -0.16666655)
               + fVar92;
          auVar118 = vpand_avx(auVar199,auVar110);
          auVar118 = vpcmpeqd_avx(auVar118,_DAT_0055f840);
          auVar132._0_4_ =
               (((fVar93 * 2.4433157e-05 + -0.0013887316) * fVar93 + 0.041666646) * fVar93 + -0.5) *
               fVar93 + 1.0;
          auVar132._4_4_ =
               (((fVar94 * 2.4433157e-05 + -0.0013887316) * fVar94 + 0.041666646) * fVar94 + -0.5) *
               fVar94 + 1.0;
          auVar132._8_4_ =
               (((fVar95 * 2.4433157e-05 + -0.0013887316) * fVar95 + 0.041666646) * fVar95 + -0.5) *
               fVar95 + 1.0;
          auVar132._12_4_ =
               (((fVar130 * 2.4433157e-05 + -0.0013887316) * fVar130 + 0.041666646) * fVar130 + -0.5
               ) * fVar130 + 1.0;
          auVar118 = vblendvps_avx(auVar132,auVar33,auVar118);
          auVar110 = vpslld_avx(auVar110,0x1d);
          auVar110 = vpand_avx(auVar110,auVar151);
          *(undefined1 (*) [16])pfVar19 = auVar110 ^ auVar151 ^ auVar118;
          pfVar19 = pfVar19 + 4;
          uVar11 = uVar21 + 7;
          uVar21 = uVar21 + 4;
        }
        if ((int)uVar21 < iVar10) {
          uVar12 = CONCAT44(0,~uVar21 + iVar10);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = uVar12;
          auVar97 = vpshufd_avx(auVar34,0x44);
          local_a0._16_16_ = auVar97;
          local_a0._0_16_ = auVar97;
          local_d0 = vpor_avx(auVar97,local_120);
          local_e0 = vpor_avx(auVar97,local_120);
          uVar17 = 0;
          auVar113 = _DAT_0055d1e0;
          do {
            auVar35._8_8_ = 0;
            auVar35._0_8_ = uVar17;
            auVar97 = vpshufd_avx(auVar35,0x44);
            auVar48._16_16_ = auVar97;
            auVar48._0_16_ = auVar97;
            auVar128 = vorps_avx(auVar48,_DAT_0055d1c0);
            auVar113 = vorps_avx(auVar48,auVar113);
            auVar110 = vpor_avx(local_a0._16_16_,local_120);
            auVar97 = vpcmpgtq_avx(auVar113._16_16_ ^ local_120,auVar110);
            auVar118 = vpcmpgtq_avx(auVar113._0_16_ ^ local_120,local_d0);
            auVar97 = vpackssdw_avx(auVar118,auVar97);
            auVar147 = in_ZMM7._0_16_;
            auVar118 = vpcmpgtq_avx(auVar128._16_16_ ^ local_120,auVar110);
            auVar111._0_4_ = auVar128._0_4_ ^ local_120._0_4_;
            auVar111._4_4_ = auVar128._4_4_ ^ local_120._4_4_;
            auVar111._8_4_ = auVar128._8_4_ ^ local_120._8_4_;
            auVar111._12_4_ = auVar128._12_4_ ^ local_120._12_4_;
            auVar110 = vpcmpgtq_avx(auVar111,local_e0);
            auVar118 = vpackssdw_avx(auVar110,auVar118);
            auVar97 = vpackssdw_avx(auVar118 ^ auVar147,auVar97 ^ auVar147);
            auVar118 = vpmovsxwd_avx(auVar97);
            auVar97 = vpunpckhwd_avx(auVar97,auVar97);
            local_c0._16_16_ = auVar97;
            local_c0._0_16_ = auVar118;
            local_100 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(pfVar19 + uVar17));
            _local_140 = local_100._16_16_;
            local_150._0_4_ = cosf(local_100._16_4_);
            local_150._4_4_ = extraout_XMM0_Db_35;
            local_150._8_4_ = extraout_XMM0_Dc_35;
            local_150._12_4_ = extraout_XMM0_Dd_35;
            auVar97 = vmovshdup_avx(_local_140);
            auVar77._0_4_ = cosf(auVar97._0_4_);
            auVar77._4_60_ = extraout_var_23;
            local_150 = vinsertps_avx(local_150,auVar77._0_16_,0x10);
            auVar97 = vpermilpd_avx(_local_140,1);
            auVar78._0_4_ = cosf(auVar97._0_4_);
            auVar78._4_60_ = extraout_var_24;
            local_150 = vinsertps_avx(local_150,auVar78._0_16_,0x20);
            auVar97 = vpermilps_avx(_local_140,0xff);
            auVar79._0_4_ = cosf(auVar97._0_4_);
            auVar79._4_60_ = extraout_var_25;
            _local_140 = vinsertps_avx(local_150,auVar79._0_16_,0x30);
            local_150._0_4_ = cosf((float)local_100._0_4_);
            local_150._4_4_ = extraout_XMM0_Db_36;
            local_150._8_4_ = extraout_XMM0_Dc_36;
            local_150._12_4_ = extraout_XMM0_Dd_36;
            auVar97 = vmovshdup_avx(local_100._0_16_);
            auVar80._0_4_ = cosf(auVar97._0_4_);
            auVar80._4_60_ = extraout_var_26;
            local_150 = vinsertps_avx(local_150,auVar80._0_16_,0x10);
            auVar97 = vpermilpd_avx(local_100._0_16_,1);
            auVar81._0_4_ = cosf(auVar97._0_4_);
            auVar81._4_60_ = extraout_var_27;
            local_150 = vinsertps_avx(local_150,auVar81._0_16_,0x20);
            auVar97 = vpermilps_avx(local_100._0_16_,0xff);
            auVar82._0_4_ = cosf(auVar97._0_4_);
            auVar113 = _DAT_0055d1e0;
            auVar82._4_60_ = extraout_var_28;
            auVar97 = vpcmpeqd_avx(auVar147,auVar147);
            in_ZMM7 = ZEXT1664(auVar97);
            auVar97 = vinsertps_avx(local_150,auVar82._0_16_,0x30);
            auVar49._16_16_ = _local_140;
            auVar49._0_16_ = auVar97;
            auVar128 = vmaskmovps_avx(local_c0,auVar49);
            *(undefined1 (*) [32])(pfVar19 + uVar17) = auVar128;
            uVar17 = uVar17 + 8;
          } while ((uVar12 + 8 & 0x1fffffff8) != uVar17);
        }
        local_128 = local_128 + 1;
      } while (local_128 != local_110);
    }
    break;
  case 0xb:
    local_60 = (long)bottom_top_blob->c;
    if (0 < local_60) {
      iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_110 = 0;
      local_120._8_8_ = 0x8000000000000000;
      local_120._0_8_ = 0x8000000000000000;
      local_128 = CONCAT44(local_128._4_4_,iVar10);
      do {
        pfVar19 = (float *)(local_108->cstep * local_110 * local_108->elemsize +
                           (long)local_108->data);
        iVar16 = (uint)local_128;
        if (iVar10 < 8) {
          uVar21 = 0;
        }
        else {
          uVar11 = 0;
          do {
            local_80 = *(undefined1 (*) [32])pfVar19;
            UnaryOp_x86_avx_functor::unary_op_tan::func_pack8(&local_151,(__m256 *)local_80);
            *(undefined1 (*) [32])pfVar19 = local_80;
            pfVar19 = pfVar19 + 8;
            uVar21 = uVar11 + 8;
            iVar10 = uVar11 + 0xf;
            uVar11 = uVar21;
          } while (iVar10 < iVar16);
        }
        auVar97 = in_ZMM5._0_16_;
        uVar11 = uVar21 | 3;
        while ((int)uVar11 < iVar16) {
          auVar91 = ZEXT856(*(ulong *)(pfVar19 + 2));
          in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
          local_80._0_16_ = (undefined1  [16])*(__m128 *)pfVar19;
          afVar236 = UnaryOp_x86_avx_functor::unary_op_tan::func_pack4
                               (&local_151,(__m128 *)local_80);
          auVar97 = in_ZMM5._0_16_;
          auVar54._0_8_ = afVar236._0_8_;
          auVar54._8_56_ = auVar91;
          local_80._0_16_ = auVar54._0_16_;
          *(undefined1 (*) [16])pfVar19 = auVar54._0_16_;
          pfVar19 = pfVar19 + 4;
          uVar11 = uVar21 + 7;
          uVar21 = uVar21 + 4;
        }
        auVar97 = vpcmpeqd_avx(auVar97,auVar97);
        in_ZMM5 = ZEXT1664(auVar97);
        if ((int)uVar21 < iVar16) {
          uVar12 = CONCAT44(0,~uVar21 + (uint)local_128);
          auVar26._8_8_ = 0;
          auVar26._0_8_ = uVar12;
          auVar118 = vpshufd_avx(auVar26,0x44);
          auVar97 = vpor_avx(auVar118,local_120);
          local_a0._0_16_ = auVar97;
          local_d0 = vpor_avx(auVar118,local_120);
          local_e0 = vpor_avx(auVar118,local_120);
          uVar17 = 0;
          auVar113 = _DAT_0055d1c0;
          auVar128 = _DAT_0055d1e0;
          do {
            auVar27._8_8_ = 0;
            auVar27._0_8_ = uVar17;
            auVar97 = vpshufd_avx(auVar27,0x44);
            auVar41._16_16_ = auVar97;
            auVar41._0_16_ = auVar97;
            auVar113 = vorps_avx(auVar41,auVar113);
            auVar128 = vorps_avx(auVar41,auVar128);
            auVar97 = vpcmpgtq_avx(auVar128._16_16_ ^ local_120,local_a0._0_16_);
            auVar118 = vpcmpgtq_avx(auVar128._0_16_ ^ local_120,local_d0);
            auVar97 = vpackssdw_avx(auVar118,auVar97);
            auVar147 = in_ZMM5._0_16_;
            auVar118 = vpcmpgtq_avx(auVar113._16_16_ ^ local_120,local_a0._0_16_);
            auVar100._0_4_ = auVar113._0_4_ ^ local_120._0_4_;
            auVar100._4_4_ = auVar113._4_4_ ^ local_120._4_4_;
            auVar100._8_4_ = auVar113._8_4_ ^ local_120._8_4_;
            auVar100._12_4_ = auVar113._12_4_ ^ local_120._12_4_;
            auVar110 = vpcmpgtq_avx(auVar100,local_e0);
            auVar118 = vpackssdw_avx(auVar110,auVar118);
            auVar97 = vpackssdw_avx(auVar118 ^ auVar147,auVar97 ^ auVar147);
            auVar118 = vpmovsxwd_avx(auVar97);
            auVar97 = vpunpckhwd_avx(auVar97,auVar97);
            local_c0._16_16_ = auVar97;
            local_c0._0_16_ = auVar118;
            local_100 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(pfVar19 + uVar17));
            _local_140 = local_100._16_16_;
            local_150._0_4_ = tanf(local_100._16_4_);
            local_150._4_4_ = extraout_XMM0_Db_09;
            local_150._8_4_ = extraout_XMM0_Dc_09;
            local_150._12_4_ = extraout_XMM0_Dd_09;
            auVar97 = vmovshdup_avx(_local_140);
            auVar55._0_4_ = tanf(auVar97._0_4_);
            auVar55._4_60_ = extraout_var_01;
            local_150 = vinsertps_avx(local_150,auVar55._0_16_,0x10);
            auVar97 = vpermilpd_avx(_local_140,1);
            auVar56._0_4_ = tanf(auVar97._0_4_);
            auVar56._4_60_ = extraout_var_02;
            local_150 = vinsertps_avx(local_150,auVar56._0_16_,0x20);
            auVar97 = vpermilps_avx(_local_140,0xff);
            auVar57._0_4_ = tanf(auVar97._0_4_);
            auVar57._4_60_ = extraout_var_03;
            _local_140 = vinsertps_avx(local_150,auVar57._0_16_,0x30);
            local_150._0_4_ = tanf((float)local_100._0_4_);
            local_150._4_4_ = extraout_XMM0_Db_10;
            local_150._8_4_ = extraout_XMM0_Dc_10;
            local_150._12_4_ = extraout_XMM0_Dd_10;
            auVar97 = vmovshdup_avx(local_100._0_16_);
            auVar58._0_4_ = tanf(auVar97._0_4_);
            auVar58._4_60_ = extraout_var_04;
            local_150 = vinsertps_avx(local_150,auVar58._0_16_,0x10);
            auVar97 = vpermilpd_avx(local_100._0_16_,1);
            auVar59._0_4_ = tanf(auVar97._0_4_);
            auVar59._4_60_ = extraout_var_05;
            local_150 = vinsertps_avx(local_150,auVar59._0_16_,0x20);
            auVar97 = vpermilps_avx(local_100._0_16_,0xff);
            auVar60._0_4_ = tanf(auVar97._0_4_);
            auVar128 = _DAT_0055d1e0;
            auVar113 = _DAT_0055d1c0;
            auVar60._4_60_ = extraout_var_06;
            auVar97 = vpcmpeqd_avx(auVar147,auVar147);
            in_ZMM5 = ZEXT1664(auVar97);
            auVar97 = vinsertps_avx(local_150,auVar60._0_16_,0x30);
            auVar42._16_16_ = _local_140;
            auVar42._0_16_ = auVar97;
            auVar200 = vmaskmovps_avx(local_c0,auVar42);
            *(undefined1 (*) [32])(pfVar19 + uVar17) = auVar200;
            uVar17 = uVar17 + 8;
          } while ((uVar12 + 8 & 0x1fffffff8) != uVar17);
        }
        local_110 = local_110 + 1;
        iVar10 = (uint)local_128;
      } while (local_110 != local_60);
    }
    break;
  case 0xc:
    local_e0._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_128 = CONCAT44(local_128._4_4_,iVar10) & 0xfffffffffffffff8;
      lVar18 = 0;
      do {
        pauVar20 = (undefined1 (*) [16])
                   (local_108->cstep * lVar18 * local_108->elemsize + (long)local_108->data);
        if (iVar10 < 8) {
          uVar21 = 0;
        }
        else {
          iVar16 = 7;
          do {
            local_140._0_4_ = *(float *)(*pauVar20 + 4);
            fVar22 = asinf(*(float *)*pauVar20);
            auVar113 = local_100;
            local_100._4_4_ = extraout_XMM0_Db_11;
            local_100._0_4_ = fVar22;
            local_100._8_4_ = extraout_XMM0_Dc_11;
            local_100._16_16_ = auVar113._16_16_;
            local_100._12_4_ = extraout_XMM0_Dd_11;
            local_140._0_4_ = asinf((float)local_140._0_4_);
            local_140._4_4_ = extraout_XMM0_Db_12;
            uStack_138 = extraout_XMM0_Dc_12;
            uStack_134 = extraout_XMM0_Dd_12;
            fVar22 = asinf(*(float *)(*pauVar20 + 8));
            auVar113 = local_c0;
            local_c0._4_4_ = extraout_XMM0_Db_13;
            local_c0._0_4_ = fVar22;
            local_c0._8_4_ = extraout_XMM0_Dc_13;
            local_c0._16_16_ = auVar113._16_16_;
            local_c0._12_4_ = extraout_XMM0_Dd_13;
            local_150._0_4_ = asinf(*(float *)(*pauVar20 + 0xc));
            local_150._4_4_ = extraout_XMM0_Db_14;
            local_150._8_4_ = extraout_XMM0_Dc_14;
            local_150._12_4_ = extraout_XMM0_Dd_14;
            local_120._0_4_ = asinf(*(float *)pauVar20[1]);
            local_120._4_4_ = extraout_XMM0_Db_15;
            local_120._8_4_ = extraout_XMM0_Dc_15;
            local_120._12_4_ = extraout_XMM0_Dd_15;
            fVar22 = asinf(*(float *)(pauVar20[1] + 4));
            auVar113 = local_a0;
            local_a0._4_4_ = extraout_XMM0_Db_16;
            local_a0._0_4_ = fVar22;
            local_a0._8_4_ = extraout_XMM0_Dc_16;
            local_a0._16_16_ = auVar113._16_16_;
            local_a0._12_4_ = extraout_XMM0_Dd_16;
            local_d0._0_4_ = asinf(*(float *)(pauVar20[1] + 8));
            local_d0._4_4_ = extraout_XMM0_Db_17;
            local_d0._8_4_ = extraout_XMM0_Dc_17;
            local_d0._12_4_ = extraout_XMM0_Dd_17;
            auVar61._0_4_ = asinf(*(float *)(pauVar20[1] + 0xc));
            auVar61._4_60_ = extraout_var_07;
            auVar97 = vinsertps_avx(local_120,ZEXT416((uint)local_a0._0_4_),0x10);
            auVar97 = vinsertps_avx(auVar97,ZEXT416((uint)local_d0._0_4_),0x20);
            auVar97 = vinsertps_avx(auVar97,auVar61._0_16_,0x30);
            auVar118 = vinsertps_avx(local_100._0_16_,ZEXT416((uint)local_140._0_4_),0x10);
            auVar118 = vinsertps_avx(auVar118,ZEXT416((uint)local_c0._0_4_),0x20);
            auVar118 = vinsertps_avx(auVar118,ZEXT416((uint)local_150._0_4_),0x30);
            *pauVar20 = auVar118;
            pauVar20[1] = auVar97;
            pauVar20 = pauVar20 + 2;
            iVar16 = iVar16 + 8;
          } while (iVar16 < iVar10);
          uVar21 = (uint)local_128;
        }
        uVar11 = uVar21 | 3;
        while ((int)uVar11 < iVar10) {
          local_140._0_4_ = *(float *)(*pauVar20 + 4);
          fVar22 = asinf(*(float *)*pauVar20);
          auVar113 = local_100;
          local_100._4_4_ = extraout_XMM0_Db_18;
          local_100._0_4_ = fVar22;
          local_100._8_4_ = extraout_XMM0_Dc_18;
          local_100._16_16_ = auVar113._16_16_;
          local_100._12_4_ = extraout_XMM0_Dd_18;
          local_140._0_4_ = asinf((float)local_140._0_4_);
          local_140._4_4_ = extraout_XMM0_Db_19;
          uStack_138 = extraout_XMM0_Dc_19;
          uStack_134 = extraout_XMM0_Dd_19;
          fVar22 = asinf(*(float *)(*pauVar20 + 8));
          auVar113 = local_c0;
          local_c0._4_4_ = extraout_XMM0_Db_20;
          local_c0._0_4_ = fVar22;
          local_c0._8_4_ = extraout_XMM0_Dc_20;
          local_c0._16_16_ = auVar113._16_16_;
          local_c0._12_4_ = extraout_XMM0_Dd_20;
          auVar62._0_4_ = asinf(*(float *)(*pauVar20 + 0xc));
          auVar62._4_60_ = extraout_var_08;
          auVar97 = vinsertps_avx(local_100._0_16_,ZEXT416((uint)local_140._0_4_),0x10);
          auVar97 = vinsertps_avx(auVar97,ZEXT416((uint)local_c0._0_4_),0x20);
          auVar97 = vinsertps_avx(auVar97,auVar62._0_16_,0x30);
          *pauVar20 = auVar97;
          pauVar20 = pauVar20 + 1;
          uVar11 = uVar21 + 7;
          uVar21 = uVar21 + 4;
        }
        if (iVar10 - uVar21 != 0 && (int)uVar21 <= iVar10) {
          lVar14 = 0;
          do {
            fVar22 = asinf(*(float *)(*pauVar20 + lVar14 * 4));
            *(float *)(*pauVar20 + lVar14 * 4) = fVar22;
            lVar14 = lVar14 + 1;
          } while (iVar10 - uVar21 != (int)lVar14);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != local_e0._0_8_);
    }
    break;
  case 0xd:
    local_e0._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_128 = CONCAT44(local_128._4_4_,iVar10) & 0xfffffffffffffff8;
      lVar18 = 0;
      do {
        pauVar20 = (undefined1 (*) [16])
                   (local_108->cstep * lVar18 * local_108->elemsize + (long)local_108->data);
        if (iVar10 < 8) {
          uVar21 = 0;
        }
        else {
          iVar16 = 7;
          do {
            local_140._0_4_ = *(float *)(*pauVar20 + 4);
            fVar22 = acosf(*(float *)*pauVar20);
            auVar113 = local_100;
            local_100._4_4_ = extraout_XMM0_Db_25;
            local_100._0_4_ = fVar22;
            local_100._8_4_ = extraout_XMM0_Dc_25;
            local_100._16_16_ = auVar113._16_16_;
            local_100._12_4_ = extraout_XMM0_Dd_25;
            local_140._0_4_ = acosf((float)local_140._0_4_);
            local_140._4_4_ = extraout_XMM0_Db_26;
            uStack_138 = extraout_XMM0_Dc_26;
            uStack_134 = extraout_XMM0_Dd_26;
            fVar22 = acosf(*(float *)(*pauVar20 + 8));
            auVar113 = local_c0;
            local_c0._4_4_ = extraout_XMM0_Db_27;
            local_c0._0_4_ = fVar22;
            local_c0._8_4_ = extraout_XMM0_Dc_27;
            local_c0._16_16_ = auVar113._16_16_;
            local_c0._12_4_ = extraout_XMM0_Dd_27;
            local_150._0_4_ = acosf(*(float *)(*pauVar20 + 0xc));
            local_150._4_4_ = extraout_XMM0_Db_28;
            local_150._8_4_ = extraout_XMM0_Dc_28;
            local_150._12_4_ = extraout_XMM0_Dd_28;
            local_120._0_4_ = acosf(*(float *)pauVar20[1]);
            local_120._4_4_ = extraout_XMM0_Db_29;
            local_120._8_4_ = extraout_XMM0_Dc_29;
            local_120._12_4_ = extraout_XMM0_Dd_29;
            fVar22 = acosf(*(float *)(pauVar20[1] + 4));
            auVar113 = local_a0;
            local_a0._4_4_ = extraout_XMM0_Db_30;
            local_a0._0_4_ = fVar22;
            local_a0._8_4_ = extraout_XMM0_Dc_30;
            local_a0._16_16_ = auVar113._16_16_;
            local_a0._12_4_ = extraout_XMM0_Dd_30;
            local_d0._0_4_ = acosf(*(float *)(pauVar20[1] + 8));
            local_d0._4_4_ = extraout_XMM0_Db_31;
            local_d0._8_4_ = extraout_XMM0_Dc_31;
            local_d0._12_4_ = extraout_XMM0_Dd_31;
            auVar75._0_4_ = acosf(*(float *)(pauVar20[1] + 0xc));
            auVar75._4_60_ = extraout_var_21;
            auVar97 = vinsertps_avx(local_120,ZEXT416((uint)local_a0._0_4_),0x10);
            auVar97 = vinsertps_avx(auVar97,ZEXT416((uint)local_d0._0_4_),0x20);
            auVar97 = vinsertps_avx(auVar97,auVar75._0_16_,0x30);
            auVar118 = vinsertps_avx(local_100._0_16_,ZEXT416((uint)local_140._0_4_),0x10);
            auVar118 = vinsertps_avx(auVar118,ZEXT416((uint)local_c0._0_4_),0x20);
            auVar118 = vinsertps_avx(auVar118,ZEXT416((uint)local_150._0_4_),0x30);
            *pauVar20 = auVar118;
            pauVar20[1] = auVar97;
            pauVar20 = pauVar20 + 2;
            iVar16 = iVar16 + 8;
          } while (iVar16 < iVar10);
          uVar21 = (uint)local_128;
        }
        uVar11 = uVar21 | 3;
        while ((int)uVar11 < iVar10) {
          local_140._0_4_ = *(float *)(*pauVar20 + 4);
          fVar22 = acosf(*(float *)*pauVar20);
          auVar113 = local_100;
          local_100._4_4_ = extraout_XMM0_Db_32;
          local_100._0_4_ = fVar22;
          local_100._8_4_ = extraout_XMM0_Dc_32;
          local_100._16_16_ = auVar113._16_16_;
          local_100._12_4_ = extraout_XMM0_Dd_32;
          local_140._0_4_ = acosf((float)local_140._0_4_);
          local_140._4_4_ = extraout_XMM0_Db_33;
          uStack_138 = extraout_XMM0_Dc_33;
          uStack_134 = extraout_XMM0_Dd_33;
          fVar22 = acosf(*(float *)(*pauVar20 + 8));
          auVar113 = local_c0;
          local_c0._4_4_ = extraout_XMM0_Db_34;
          local_c0._0_4_ = fVar22;
          local_c0._8_4_ = extraout_XMM0_Dc_34;
          local_c0._16_16_ = auVar113._16_16_;
          local_c0._12_4_ = extraout_XMM0_Dd_34;
          auVar76._0_4_ = acosf(*(float *)(*pauVar20 + 0xc));
          auVar76._4_60_ = extraout_var_22;
          auVar97 = vinsertps_avx(local_100._0_16_,ZEXT416((uint)local_140._0_4_),0x10);
          auVar97 = vinsertps_avx(auVar97,ZEXT416((uint)local_c0._0_4_),0x20);
          auVar97 = vinsertps_avx(auVar97,auVar76._0_16_,0x30);
          *pauVar20 = auVar97;
          pauVar20 = pauVar20 + 1;
          uVar11 = uVar21 + 7;
          uVar21 = uVar21 + 4;
        }
        if (iVar10 - uVar21 != 0 && (int)uVar21 <= iVar10) {
          lVar14 = 0;
          do {
            fVar22 = acosf(*(float *)(*pauVar20 + lVar14 * 4));
            *(float *)(*pauVar20 + lVar14 * 4) = fVar22;
            lVar14 = lVar14 + 1;
          } while (iVar10 - uVar21 != (int)lVar14);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != local_e0._0_8_);
    }
    break;
  case 0xe:
    local_e0._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_128 = CONCAT44(local_128._4_4_,iVar10) & 0xfffffffffffffff8;
      lVar18 = 0;
      do {
        pauVar20 = (undefined1 (*) [16])
                   (local_108->cstep * lVar18 * local_108->elemsize + (long)local_108->data);
        if (iVar10 < 8) {
          uVar21 = 0;
        }
        else {
          iVar16 = 7;
          do {
            local_140._0_4_ = *(float *)(*pauVar20 + 4);
            fVar22 = atanf(*(float *)*pauVar20);
            auVar113 = local_100;
            local_100._4_4_ = extraout_XMM0_Db;
            local_100._0_4_ = fVar22;
            local_100._8_4_ = extraout_XMM0_Dc;
            local_100._16_16_ = auVar113._16_16_;
            local_100._12_4_ = extraout_XMM0_Dd;
            local_140._0_4_ = atanf((float)local_140._0_4_);
            local_140._4_4_ = extraout_XMM0_Db_00;
            uStack_138 = extraout_XMM0_Dc_00;
            uStack_134 = extraout_XMM0_Dd_00;
            fVar22 = atanf(*(float *)(*pauVar20 + 8));
            auVar113 = local_c0;
            local_c0._4_4_ = extraout_XMM0_Db_01;
            local_c0._0_4_ = fVar22;
            local_c0._8_4_ = extraout_XMM0_Dc_01;
            local_c0._16_16_ = auVar113._16_16_;
            local_c0._12_4_ = extraout_XMM0_Dd_01;
            local_150._0_4_ = atanf(*(float *)(*pauVar20 + 0xc));
            local_150._4_4_ = extraout_XMM0_Db_02;
            local_150._8_4_ = extraout_XMM0_Dc_02;
            local_150._12_4_ = extraout_XMM0_Dd_02;
            local_120._0_4_ = atanf(*(float *)pauVar20[1]);
            local_120._4_4_ = extraout_XMM0_Db_03;
            local_120._8_4_ = extraout_XMM0_Dc_03;
            local_120._12_4_ = extraout_XMM0_Dd_03;
            fVar22 = atanf(*(float *)(pauVar20[1] + 4));
            auVar113 = local_a0;
            local_a0._4_4_ = extraout_XMM0_Db_04;
            local_a0._0_4_ = fVar22;
            local_a0._8_4_ = extraout_XMM0_Dc_04;
            local_a0._16_16_ = auVar113._16_16_;
            local_a0._12_4_ = extraout_XMM0_Dd_04;
            local_d0._0_4_ = atanf(*(float *)(pauVar20[1] + 8));
            local_d0._4_4_ = extraout_XMM0_Db_05;
            local_d0._8_4_ = extraout_XMM0_Dc_05;
            local_d0._12_4_ = extraout_XMM0_Dd_05;
            auVar52._0_4_ = atanf(*(float *)(pauVar20[1] + 0xc));
            auVar52._4_60_ = extraout_var;
            auVar97 = vinsertps_avx(local_120,ZEXT416((uint)local_a0._0_4_),0x10);
            auVar97 = vinsertps_avx(auVar97,ZEXT416((uint)local_d0._0_4_),0x20);
            auVar97 = vinsertps_avx(auVar97,auVar52._0_16_,0x30);
            auVar118 = vinsertps_avx(local_100._0_16_,ZEXT416((uint)local_140._0_4_),0x10);
            auVar118 = vinsertps_avx(auVar118,ZEXT416((uint)local_c0._0_4_),0x20);
            auVar118 = vinsertps_avx(auVar118,ZEXT416((uint)local_150._0_4_),0x30);
            *pauVar20 = auVar118;
            pauVar20[1] = auVar97;
            pauVar20 = pauVar20 + 2;
            iVar16 = iVar16 + 8;
          } while (iVar16 < iVar10);
          uVar21 = (uint)local_128;
        }
        uVar11 = uVar21 | 3;
        while ((int)uVar11 < iVar10) {
          local_140._0_4_ = *(float *)(*pauVar20 + 4);
          fVar22 = atanf(*(float *)*pauVar20);
          auVar113 = local_100;
          local_100._4_4_ = extraout_XMM0_Db_06;
          local_100._0_4_ = fVar22;
          local_100._8_4_ = extraout_XMM0_Dc_06;
          local_100._16_16_ = auVar113._16_16_;
          local_100._12_4_ = extraout_XMM0_Dd_06;
          local_140._0_4_ = atanf((float)local_140._0_4_);
          local_140._4_4_ = extraout_XMM0_Db_07;
          uStack_138 = extraout_XMM0_Dc_07;
          uStack_134 = extraout_XMM0_Dd_07;
          fVar22 = atanf(*(float *)(*pauVar20 + 8));
          auVar113 = local_c0;
          local_c0._4_4_ = extraout_XMM0_Db_08;
          local_c0._0_4_ = fVar22;
          local_c0._8_4_ = extraout_XMM0_Dc_08;
          local_c0._16_16_ = auVar113._16_16_;
          local_c0._12_4_ = extraout_XMM0_Dd_08;
          auVar53._0_4_ = atanf(*(float *)(*pauVar20 + 0xc));
          auVar53._4_60_ = extraout_var_00;
          auVar97 = vinsertps_avx(local_100._0_16_,ZEXT416((uint)local_140._0_4_),0x10);
          auVar97 = vinsertps_avx(auVar97,ZEXT416((uint)local_c0._0_4_),0x20);
          auVar97 = vinsertps_avx(auVar97,auVar53._0_16_,0x30);
          *pauVar20 = auVar97;
          pauVar20 = pauVar20 + 1;
          uVar11 = uVar21 + 7;
          uVar21 = uVar21 + 4;
        }
        if (iVar10 - uVar21 != 0 && (int)uVar21 <= iVar10) {
          lVar14 = 0;
          do {
            fVar22 = atanf(*(float *)(*pauVar20 + lVar14 * 4));
            *(float *)(*pauVar20 + lVar14 * 4) = fVar22;
            lVar14 = lVar14 + 1;
          } while (iVar10 - uVar21 != (int)lVar14);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != local_e0._0_8_);
    }
    break;
  case 0xf:
    iVar10 = bottom_top_blob->c;
    if (0 < (long)iVar10) {
      uVar21 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar18 = 0;
      auVar45._8_4_ = 0x3f800000;
      auVar45._0_8_ = 0x3f8000003f800000;
      auVar45._12_4_ = 0x3f800000;
      auVar45._16_4_ = 0x3f800000;
      auVar45._20_4_ = 0x3f800000;
      auVar45._24_4_ = 0x3f800000;
      auVar45._28_4_ = 0x3f800000;
      auVar104._8_4_ = 0x3f800000;
      auVar104._0_8_ = 0x3f8000003f800000;
      auVar104._12_4_ = 0x3f800000;
      auVar140._8_8_ = 0x8000000000000000;
      auVar140._0_8_ = 0x8000000000000000;
      auVar97 = vpcmpeqd_avx(auVar118,auVar118);
      do {
        pauVar15 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar18 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar21 < 8) {
          uVar11 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar200 = *pauVar15;
            auVar2 = vrcpps_avx(auVar200);
            fVar22 = auVar2._0_4_;
            fVar89 = auVar2._4_4_;
            auVar5._4_4_ = auVar200._4_4_ * fVar89;
            auVar5._0_4_ = auVar200._0_4_ * fVar22;
            fVar90 = auVar2._8_4_;
            auVar5._8_4_ = auVar200._8_4_ * fVar90;
            fVar92 = auVar2._12_4_;
            auVar5._12_4_ = auVar200._12_4_ * fVar92;
            fVar93 = auVar2._16_4_;
            auVar5._16_4_ = auVar200._16_4_ * fVar93;
            fVar94 = auVar2._20_4_;
            auVar5._20_4_ = auVar200._20_4_ * fVar94;
            fVar95 = auVar2._24_4_;
            auVar5._24_4_ = auVar200._24_4_ * fVar95;
            auVar5._28_4_ = auVar200._28_4_;
            auVar200 = vsubps_avx(auVar45,auVar5);
            auVar163._0_4_ = fVar22 + fVar22 * auVar200._0_4_;
            auVar163._4_4_ = fVar89 + fVar89 * auVar200._4_4_;
            auVar163._8_4_ = fVar90 + fVar90 * auVar200._8_4_;
            auVar163._12_4_ = fVar92 + fVar92 * auVar200._12_4_;
            auVar163._16_4_ = fVar93 + fVar93 * auVar200._16_4_;
            auVar163._20_4_ = fVar94 + fVar94 * auVar200._20_4_;
            auVar163._24_4_ = fVar95 + fVar95 * auVar200._24_4_;
            auVar163._28_4_ = auVar2._28_4_ + auVar200._28_4_;
            *pauVar15 = auVar163;
            pauVar15 = pauVar15 + 1;
            iVar16 = iVar16 + 8;
            uVar11 = uVar21 & 0xfffffff8;
          } while (iVar16 < (int)uVar21);
        }
        uVar13 = uVar11 | 3;
        while ((int)uVar13 < (int)uVar21) {
          auVar118 = *(undefined1 (*) [16])*pauVar15;
          auVar110 = vrcpps_avx(auVar118);
          fVar22 = auVar110._0_4_;
          auVar155._0_4_ = auVar118._0_4_ * fVar22;
          fVar89 = auVar110._4_4_;
          auVar155._4_4_ = auVar118._4_4_ * fVar89;
          fVar90 = auVar110._8_4_;
          auVar155._8_4_ = auVar118._8_4_ * fVar90;
          fVar92 = auVar110._12_4_;
          auVar155._12_4_ = auVar118._12_4_ * fVar92;
          auVar118 = vsubps_avx(auVar104,auVar155);
          auVar156._0_4_ = fVar22 + fVar22 * auVar118._0_4_;
          auVar156._4_4_ = fVar89 + fVar89 * auVar118._4_4_;
          auVar156._8_4_ = fVar90 + fVar90 * auVar118._8_4_;
          auVar156._12_4_ = fVar92 + fVar92 * auVar118._12_4_;
          *(undefined1 (*) [16])*pauVar15 = auVar156;
          pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
          uVar13 = uVar11 + 7;
          uVar11 = uVar11 + 4;
        }
        if ((int)uVar11 < (int)uVar21) {
          uVar12 = CONCAT44(0,~uVar11 + uVar21);
          auVar157._8_8_ = 0;
          auVar157._0_8_ = uVar12;
          auVar147 = vpshufd_avx(auVar157,0x44);
          auVar118 = vorps_avx(auVar147,auVar140);
          auVar110 = vorps_avx(auVar147,auVar140);
          auVar147 = vorps_avx(auVar147,auVar140);
          uVar17 = 0;
          do {
            auVar191._8_8_ = 0;
            auVar191._0_8_ = uVar17;
            auVar154 = vpshufd_avx(auVar191,0x44);
            auVar201._16_16_ = auVar154;
            auVar201._0_16_ = auVar154;
            auVar200 = vorps_avx(auVar201,auVar113);
            auVar2 = vorps_avx(auVar201,auVar128);
            auVar220._0_8_ = auVar2._16_8_ ^ 0x8000000000000000;
            auVar220._8_4_ = auVar2._24_4_;
            auVar220._12_4_ = auVar2._28_4_ ^ 0x80000000;
            auVar154 = vpcmpgtq_avx(auVar220,auVar118);
            auVar192._0_8_ = auVar2._0_8_ ^ 0x8000000000000000;
            auVar192._8_4_ = auVar2._8_4_;
            auVar192._12_4_ = auVar2._12_4_ ^ 0x80000000;
            auVar166 = vpcmpgtq_avx(auVar192,auVar110);
            auVar154 = vpackssdw_avx(auVar166,auVar154);
            auVar221._0_8_ = auVar200._16_8_ ^ 0x8000000000000000;
            auVar221._8_4_ = auVar200._24_4_;
            auVar221._12_4_ = auVar200._28_4_ ^ 0x80000000;
            auVar166 = vpcmpgtq_avx(auVar221,auVar118);
            auVar210._0_8_ = auVar200._0_8_ ^ 0x8000000000000000;
            auVar210._8_4_ = auVar200._8_4_;
            auVar210._12_4_ = auVar200._12_4_ ^ 0x80000000;
            auVar23 = vpcmpgtq_avx(auVar210,auVar147);
            auVar166 = vpackssdw_avx(auVar23,auVar166);
            auVar154 = vpackssdw_avx(auVar166 ^ auVar97,auVar154 ^ auVar97);
            auVar166 = vpmovsxwd_avx(auVar154);
            auVar154 = vpunpckhwd_avx(auVar154,auVar154);
            auVar202._16_16_ = auVar154;
            auVar202._0_16_ = auVar166;
            auVar2 = vmaskmovps_avx(auVar202,*(undefined1 (*) [32])(*pauVar15 + uVar17 * 4));
            auVar200 = vrcpps_avx(auVar2);
            fVar22 = auVar200._0_4_;
            fVar89 = auVar200._4_4_;
            auVar6._4_4_ = auVar2._4_4_ * fVar89;
            auVar6._0_4_ = auVar2._0_4_ * fVar22;
            fVar90 = auVar200._8_4_;
            auVar6._8_4_ = auVar2._8_4_ * fVar90;
            fVar92 = auVar200._12_4_;
            auVar6._12_4_ = auVar2._12_4_ * fVar92;
            fVar93 = auVar200._16_4_;
            auVar6._16_4_ = auVar2._16_4_ * fVar93;
            fVar94 = auVar200._20_4_;
            auVar6._20_4_ = auVar2._20_4_ * fVar94;
            fVar95 = auVar200._24_4_;
            auVar6._24_4_ = auVar2._24_4_ * fVar95;
            auVar6._28_4_ = auVar2._28_4_;
            auVar2 = vsubps_avx(auVar45,auVar6);
            auVar217._0_4_ = fVar22 + fVar22 * auVar2._0_4_;
            auVar217._4_4_ = fVar89 + fVar89 * auVar2._4_4_;
            auVar217._8_4_ = fVar90 + fVar90 * auVar2._8_4_;
            auVar217._12_4_ = fVar92 + fVar92 * auVar2._12_4_;
            auVar217._16_4_ = fVar93 + fVar93 * auVar2._16_4_;
            auVar217._20_4_ = fVar94 + fVar94 * auVar2._20_4_;
            auVar217._24_4_ = fVar95 + fVar95 * auVar2._24_4_;
            auVar217._28_4_ = auVar200._28_4_ + auVar2._28_4_;
            auVar200 = vmaskmovps_avx(auVar202,auVar217);
            *(undefined1 (*) [32])(*pauVar15 + uVar17 * 4) = auVar200;
            uVar17 = uVar17 + 8;
          } while ((uVar12 + 8 & 0x1fffffff8) != uVar17);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar10);
    }
    break;
  case 0x10:
    local_100._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      uVar21 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_140._0_4_ = uVar21 & 0xfffffff8;
      lVar18 = 0;
      do {
        auVar200._8_4_ = 0x3f800000;
        auVar200._0_8_ = 0x3f8000003f800000;
        auVar128._8_4_ = 0xc2b0c0a5;
        auVar128._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar113._8_4_ = 0x42b0c0a5;
        auVar113._0_8_ = 0x42b0c0a542b0c0a5;
        auVar200._12_4_ = 0x3f800000;
        auVar128._12_4_ = 0xc2b0c0a5;
        auVar113._12_4_ = 0x42b0c0a5;
        auVar200._16_4_ = 0x3f800000;
        auVar128._16_4_ = 0xc2b0c0a5;
        auVar113._16_4_ = 0x42b0c0a5;
        auVar200._20_4_ = 0x3f800000;
        auVar128._20_4_ = 0xc2b0c0a5;
        auVar113._20_4_ = 0x42b0c0a5;
        auVar200._24_4_ = 0x3f800000;
        auVar128._24_4_ = 0xc2b0c0a5;
        auVar113._24_4_ = 0x42b0c0a5;
        auVar200._28_4_ = 0x3f800000;
        auVar128._28_4_ = 0xc2b0c0a5;
        auVar113._28_4_ = 0x42b0c0a5;
        pfVar19 = (float *)(local_108->cstep * lVar18 * local_108->elemsize + (long)local_108->data)
        ;
        if ((int)uVar21 < 8) {
          uVar11 = 0;
        }
        else {
          iVar10 = 7;
          do {
            auVar2._4_4_ = pfVar19[1] * -2.0;
            auVar2._0_4_ = *pfVar19 * -2.0;
            auVar2._8_4_ = pfVar19[2] * -2.0;
            auVar2._12_4_ = pfVar19[3] * -2.0;
            auVar2._16_4_ = pfVar19[4] * -2.0;
            auVar2._20_4_ = pfVar19[5] * -2.0;
            auVar2._24_4_ = pfVar19[6] * -2.0;
            auVar2._28_4_ = 0xc0000000;
            auVar2 = vminps_avx(auVar2,auVar113);
            auVar1 = vmaxps_avx(auVar2,auVar128);
            auVar114._0_4_ = auVar1._0_4_ * 1.442695 + 0.5;
            auVar114._4_4_ = auVar1._4_4_ * 1.442695 + 0.5;
            auVar114._8_4_ = auVar1._8_4_ * 1.442695 + 0.5;
            auVar114._12_4_ = auVar1._12_4_ * 1.442695 + 0.5;
            auVar114._16_4_ = auVar1._16_4_ * 1.442695 + 0.5;
            auVar114._20_4_ = auVar1._20_4_ * 1.442695 + 0.5;
            auVar114._24_4_ = auVar1._24_4_ * 1.442695 + 0.5;
            auVar114._28_4_ = 0x42b1c0a5;
            auVar133 = vroundps_avx(auVar114,1);
            auVar2 = vcmpps_avx(auVar114,auVar133,1);
            auVar2 = vandps_avx(auVar200,auVar2);
            auVar2 = vsubps_avx(auVar133,auVar2);
            fVar22 = auVar1._0_4_ + auVar2._0_4_ * -0.6931472;
            fVar89 = auVar1._4_4_ + auVar2._4_4_ * -0.6931472;
            fVar90 = auVar1._8_4_ + auVar2._8_4_ * -0.6931472;
            fVar92 = auVar1._12_4_ + auVar2._12_4_ * -0.6931472;
            fVar93 = auVar1._16_4_ + auVar2._16_4_ * -0.6931472;
            fVar94 = auVar1._20_4_ + auVar2._20_4_ * -0.6931472;
            fVar95 = auVar1._24_4_ + auVar2._24_4_ * -0.6931472;
            auVar97._0_4_ = (int)auVar2._0_4_;
            auVar97._4_4_ = (int)auVar2._4_4_;
            auVar97._8_4_ = (int)auVar2._8_4_;
            auVar97._12_4_ = (int)auVar2._12_4_;
            auVar115._16_4_ = (int)auVar2._16_4_;
            auVar115._0_16_ = auVar97;
            auVar115._20_4_ = (int)auVar2._20_4_;
            auVar115._24_4_ = (int)auVar2._24_4_;
            auVar115._28_4_ = (int)auVar2._28_4_;
            auVar118 = vpslld_avx(auVar97,0x17);
            auVar97 = vpslld_avx(auVar115._16_16_,0x17);
            auVar110._8_4_ = 0x3f800000;
            auVar110._0_8_ = 0x3f8000003f800000;
            auVar110._12_4_ = 0x3f800000;
            auVar97 = vpaddd_avx(auVar97,auVar110);
            auVar118 = vpaddd_avx(auVar118,auVar110);
            auVar40._0_4_ =
                 (fVar22 + 1.0 +
                 fVar22 * fVar22 *
                 (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 + 0.008333452) * fVar22 +
                   0.041665796) * fVar22 + 0.16666666) * fVar22 + 0.5)) * auVar118._0_4_ + 1.0;
            auVar40._4_4_ =
                 (fVar89 + 1.0 +
                 fVar89 * fVar89 *
                 (((((fVar89 * 0.00019875691 + 0.0013981999) * fVar89 + 0.008333452) * fVar89 +
                   0.041665796) * fVar89 + 0.16666666) * fVar89 + 0.5)) * auVar118._4_4_ + 1.0;
            auVar40._8_4_ =
                 (fVar90 + 1.0 +
                 fVar90 * fVar90 *
                 (((((fVar90 * 0.00019875691 + 0.0013981999) * fVar90 + 0.008333452) * fVar90 +
                   0.041665796) * fVar90 + 0.16666666) * fVar90 + 0.5)) * auVar118._8_4_ + 1.0;
            auVar40._12_4_ =
                 (fVar92 + 1.0 +
                 fVar92 * fVar92 *
                 (((((fVar92 * 0.00019875691 + 0.0013981999) * fVar92 + 0.008333452) * fVar92 +
                   0.041665796) * fVar92 + 0.16666666) * fVar92 + 0.5)) * auVar118._12_4_ + 1.0;
            auVar40._16_4_ =
                 (fVar93 + 1.0 +
                 fVar93 * fVar93 *
                 (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) * fVar93 +
                   0.041665796) * fVar93 + 0.16666666) * fVar93 + 0.5)) * auVar97._0_4_ + 1.0;
            auVar40._20_4_ =
                 (fVar94 + 1.0 +
                 fVar94 * fVar94 *
                 (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) * fVar94 +
                   0.041665796) * fVar94 + 0.16666666) * fVar94 + 0.5)) * auVar97._4_4_ + 1.0;
            auVar40._24_4_ =
                 (fVar95 + 1.0 +
                 fVar95 * fVar95 *
                 (((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 + 0.008333452) * fVar95 +
                   0.041665796) * fVar95 + 0.16666666) * fVar95 + 0.5)) * auVar97._8_4_ + 1.0;
            auVar40._28_4_ = auVar1._28_4_ + auVar133._28_4_ + 1.0 + auVar133._28_4_ + 1.0;
            auVar2 = vrcpps_avx(auVar40);
            fVar22 = auVar2._0_4_;
            fVar89 = auVar2._4_4_;
            fVar90 = auVar2._8_4_;
            fVar92 = auVar2._12_4_;
            fVar93 = auVar2._16_4_;
            fVar94 = auVar2._20_4_;
            fVar95 = auVar2._24_4_;
            auVar1._4_4_ = auVar40._4_4_ * (fVar89 + fVar89);
            auVar1._0_4_ = auVar40._0_4_ * (fVar22 + fVar22);
            auVar1._8_4_ = auVar40._8_4_ * (fVar90 + fVar90);
            auVar1._12_4_ = auVar40._12_4_ * (fVar92 + fVar92);
            auVar1._16_4_ = auVar40._16_4_ * (fVar93 + fVar93);
            auVar1._20_4_ = auVar40._20_4_ * (fVar94 + fVar94);
            auVar1._24_4_ = auVar40._24_4_ * (fVar95 + fVar95);
            auVar1._28_4_ = auVar40._28_4_;
            auVar133._8_4_ = 0x40000000;
            auVar133._0_8_ = 0x4000000040000000;
            auVar133._12_4_ = 0x40000000;
            auVar133._16_4_ = 0x40000000;
            auVar133._20_4_ = 0x40000000;
            auVar133._24_4_ = 0x40000000;
            auVar133._28_4_ = 0x40000000;
            auVar1 = vsubps_avx(auVar133,auVar1);
            *pfVar19 = fVar22 + fVar22 + -1.0 + fVar22 * auVar1._0_4_;
            pfVar19[1] = fVar89 + fVar89 + -1.0 + fVar89 * auVar1._4_4_;
            pfVar19[2] = fVar90 + fVar90 + -1.0 + fVar90 * auVar1._8_4_;
            pfVar19[3] = fVar92 + fVar92 + -1.0 + fVar92 * auVar1._12_4_;
            pfVar19[4] = fVar93 + fVar93 + -1.0 + fVar93 * auVar1._16_4_;
            pfVar19[5] = fVar94 + fVar94 + -1.0 + fVar94 * auVar1._20_4_;
            pfVar19[6] = fVar95 + fVar95 + -1.0 + fVar95 * auVar1._24_4_;
            pfVar19[7] = auVar2._28_4_ + auVar2._28_4_ + -1.0 + auVar1._28_4_;
            pfVar19 = pfVar19 + 8;
            iVar10 = iVar10 + 8;
          } while (iVar10 < (int)uVar21);
          uVar11 = local_140._0_4_;
        }
        auVar118._8_4_ = 0x3f800000;
        auVar118._0_8_ = 0x3f8000003f800000;
        auVar118._12_4_ = 0x3f800000;
        auVar154._8_4_ = 0x42b0c0a5;
        auVar154._0_8_ = 0x42b0c0a542b0c0a5;
        auVar154._12_4_ = 0x42b0c0a5;
        auVar166._8_4_ = 0xc2b0c0a5;
        auVar166._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar166._12_4_ = 0xc2b0c0a5;
        auVar147._8_4_ = 0x40000000;
        auVar147._0_8_ = 0x4000000040000000;
        auVar147._12_4_ = 0x40000000;
        uVar13 = uVar11 | 3;
        while ((int)uVar13 < (int)uVar21) {
          auVar23._0_4_ = *pfVar19 * -2.0;
          auVar23._4_4_ = pfVar19[1] * -2.0;
          auVar23._8_4_ = pfVar19[2] * -2.0;
          auVar23._12_4_ = pfVar19[3] * -2.0;
          auVar97 = vminps_avx(auVar23,auVar154);
          auVar23 = vmaxps_avx(auVar97,auVar166);
          auVar98._0_4_ = auVar23._0_4_ * 1.442695 + 0.5;
          auVar98._4_4_ = auVar23._4_4_ * 1.442695 + 0.5;
          auVar98._8_4_ = auVar23._8_4_ * 1.442695 + 0.5;
          auVar98._12_4_ = auVar23._12_4_ * 1.442695 + 0.5;
          auVar119._0_4_ = (int)auVar98._0_4_;
          auVar119._4_4_ = (int)auVar98._4_4_;
          auVar119._8_4_ = (int)auVar98._8_4_;
          auVar119._12_4_ = (int)auVar98._12_4_;
          auVar110 = vcvtdq2ps_avx(auVar119);
          auVar97 = vcmpps_avx(auVar98,auVar110,1);
          auVar97 = vandps_avx(auVar97,auVar118);
          auVar97 = vsubps_avx(auVar110,auVar97);
          fVar22 = auVar23._0_4_ + auVar97._0_4_ * -0.6931472;
          fVar89 = auVar23._4_4_ + auVar97._4_4_ * -0.6931472;
          fVar90 = auVar23._8_4_ + auVar97._8_4_ * -0.6931472;
          fVar92 = auVar23._12_4_ + auVar97._12_4_ * -0.6931472;
          auVar99._0_4_ = (int)auVar97._0_4_;
          auVar99._4_4_ = (int)auVar97._4_4_;
          auVar99._8_4_ = (int)auVar97._8_4_;
          auVar99._12_4_ = (int)auVar97._12_4_;
          auVar97 = vpslld_avx(auVar99,0x17);
          auVar97 = vpaddd_avx(auVar97,auVar118);
          auVar24._0_4_ =
               (fVar22 + 1.0 +
               fVar22 * fVar22 *
               (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 + 0.008333452) * fVar22 +
                 0.041665796) * fVar22 + 0.16666666) * fVar22 + 0.5)) * auVar97._0_4_ + 1.0;
          auVar24._4_4_ =
               (fVar89 + 1.0 +
               fVar89 * fVar89 *
               (((((fVar89 * 0.00019875691 + 0.0013981999) * fVar89 + 0.008333452) * fVar89 +
                 0.041665796) * fVar89 + 0.16666666) * fVar89 + 0.5)) * auVar97._4_4_ + 1.0;
          auVar24._8_4_ =
               (fVar90 + 1.0 +
               fVar90 * fVar90 *
               (((((fVar90 * 0.00019875691 + 0.0013981999) * fVar90 + 0.008333452) * fVar90 +
                 0.041665796) * fVar90 + 0.16666666) * fVar90 + 0.5)) * auVar97._8_4_ + 1.0;
          auVar24._12_4_ =
               (fVar92 + 1.0 +
               fVar92 * fVar92 *
               (((((fVar92 * 0.00019875691 + 0.0013981999) * fVar92 + 0.008333452) * fVar92 +
                 0.041665796) * fVar92 + 0.16666666) * fVar92 + 0.5)) * auVar97._12_4_ + 1.0;
          auVar97 = vrcpps_avx(auVar24);
          fVar22 = auVar97._0_4_;
          fVar89 = auVar97._4_4_;
          fVar90 = auVar97._8_4_;
          fVar92 = auVar97._12_4_;
          auVar25._0_4_ = auVar24._0_4_ * (fVar22 + fVar22);
          auVar25._4_4_ = auVar24._4_4_ * (fVar89 + fVar89);
          auVar25._8_4_ = auVar24._8_4_ * (fVar90 + fVar90);
          auVar25._12_4_ = auVar24._12_4_ * (fVar92 + fVar92);
          auVar97 = vsubps_avx(auVar147,auVar25);
          *pfVar19 = fVar22 + fVar22 + -1.0 + fVar22 * auVar97._0_4_;
          pfVar19[1] = fVar89 + fVar89 + -1.0 + fVar89 * auVar97._4_4_;
          pfVar19[2] = fVar90 + fVar90 + -1.0 + fVar90 * auVar97._8_4_;
          pfVar19[3] = fVar92 + fVar92 + -1.0 + fVar92 * auVar97._12_4_;
          pfVar19 = pfVar19 + 4;
          uVar13 = uVar11 + 7;
          uVar11 = uVar11 + 4;
        }
        if (uVar21 - uVar11 != 0 && (int)uVar11 <= (int)uVar21) {
          lVar14 = 0;
          do {
            fVar22 = tanhf(pfVar19[lVar14]);
            pfVar19[lVar14] = fVar22;
            lVar14 = lVar14 + 1;
          } while (uVar21 - uVar11 != (int)lVar14);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != local_100._0_8_);
    }
  }
  return 0;
}

Assistant:

int UnaryOp_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace UnaryOp_x86_avx_functor;
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    return 0;
}